

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx2::CurveNiIntersector1<4>::
     occluded_t<embree::avx2::RibbonCurve1Intersector1<embree::CatmullRomCurveT,8>,embree::avx2::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [12];
  undefined1 (*pauVar5) [28];
  float *pfVar6;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  Primitive PVar10;
  int iVar11;
  Geometry *pGVar12;
  RTCFilterFunctionN p_Var13;
  undefined1 auVar14 [32];
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  long lVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [28];
  uint uVar87;
  RTCIntersectArguments *pRVar88;
  ulong uVar89;
  Geometry *geometry;
  long lVar90;
  ulong uVar91;
  long lVar92;
  byte bVar93;
  undefined4 uVar94;
  undefined8 unaff_R14;
  ulong uVar95;
  undefined8 uVar96;
  float fVar111;
  vint4 bi_2;
  undefined1 auVar102 [16];
  undefined1 auVar97 [16];
  float fVar110;
  float fVar112;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar113;
  float fVar114;
  float fVar115;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar101 [16];
  undefined1 auVar109 [32];
  vint4 bi_1;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [64];
  float fVar129;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  vint4 ai_2;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [64];
  vint4 ai;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  vint4 bi;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  vint4 ai_1;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [64];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [64];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [64];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar186 [32];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar187 [64];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [64];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [64];
  undefined1 auVar196 [16];
  undefined1 auVar197 [64];
  float fVar198;
  float fVar204;
  undefined1 auVar199 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [64];
  undefined1 auVar205 [64];
  RTCFilterFunctionNArguments args;
  int local_794;
  long local_790;
  Primitive *local_788;
  undefined1 local_780 [8];
  undefined1 auStack_778 [8];
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  ulong local_710;
  Precalculations *local_708;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  RTCFilterFunctionNArguments local_5d0;
  undefined1 local_5a0 [32];
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined8 local_4e0;
  undefined4 local_4d8;
  float local_4d4;
  undefined4 local_4d0;
  undefined4 local_4cc;
  undefined4 local_4c8;
  uint local_4c4;
  uint local_4c0;
  ulong local_4a8;
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  ulong local_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  int iStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  int local_220;
  int local_21c;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined1 local_160 [32];
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar183 [64];
  undefined1 auVar200 [16];
  
  local_708 = pre;
  PVar10 = prim[1];
  uVar89 = (ulong)(byte)PVar10;
  auVar20 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar89 * 0x19 + 6));
  fVar129 = *(float *)(prim + uVar89 * 0x19 + 0x12);
  auVar97._0_4_ = fVar129 * auVar20._0_4_;
  auVar97._4_4_ = fVar129 * auVar20._4_4_;
  auVar97._8_4_ = fVar129 * auVar20._8_4_;
  auVar97._12_4_ = fVar129 * auVar20._12_4_;
  auVar152._0_4_ = fVar129 * (ray->dir).field_0.m128[0];
  auVar152._4_4_ = fVar129 * (ray->dir).field_0.m128[1];
  auVar152._8_4_ = fVar129 * (ray->dir).field_0.m128[2];
  auVar152._12_4_ = fVar129 * (ray->dir).field_0.m128[3];
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 4 + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 5 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar102 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 6 + 6)));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 0xb + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 0xc + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 0xd + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar100 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 0x12 + 6)));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar99 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 0x13 + 6)));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar190 = ZEXT1664(auVar99);
  auVar130 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 0x14 + 6)));
  auVar130 = vcvtdq2ps_avx(auVar130);
  auVar197 = ZEXT1664(auVar130);
  auVar199._4_4_ = auVar152._0_4_;
  auVar199._0_4_ = auVar152._0_4_;
  auVar199._8_4_ = auVar152._0_4_;
  auVar199._12_4_ = auVar152._0_4_;
  auVar117 = vshufps_avx(auVar152,auVar152,0x55);
  auVar98 = vshufps_avx(auVar152,auVar152,0xaa);
  fVar129 = auVar98._0_4_;
  auVar184._0_4_ = fVar129 * auVar102._0_4_;
  fVar110 = auVar98._4_4_;
  auVar184._4_4_ = fVar110 * auVar102._4_4_;
  fVar111 = auVar98._8_4_;
  auVar184._8_4_ = fVar111 * auVar102._8_4_;
  fVar112 = auVar98._12_4_;
  auVar184._12_4_ = fVar112 * auVar102._12_4_;
  auVar175._0_4_ = auVar19._0_4_ * fVar129;
  auVar175._4_4_ = auVar19._4_4_ * fVar110;
  auVar175._8_4_ = auVar19._8_4_ * fVar111;
  auVar175._12_4_ = auVar19._12_4_ * fVar112;
  auVar168._0_4_ = auVar130._0_4_ * fVar129;
  auVar168._4_4_ = auVar130._4_4_ * fVar110;
  auVar168._8_4_ = auVar130._8_4_ * fVar111;
  auVar168._12_4_ = auVar130._12_4_ * fVar112;
  auVar98 = vfmadd231ps_fma(auVar184,auVar117,auVar16);
  auVar118 = vfmadd231ps_fma(auVar175,auVar117,auVar18);
  auVar117 = vfmadd231ps_fma(auVar168,auVar99,auVar117);
  auVar140 = vfmadd231ps_fma(auVar98,auVar199,auVar20);
  auVar187 = ZEXT1664(auVar140);
  auVar118 = vfmadd231ps_fma(auVar118,auVar199,auVar17);
  auVar146 = vfmadd231ps_fma(auVar117,auVar100,auVar199);
  auVar200._4_4_ = auVar97._0_4_;
  auVar200._0_4_ = auVar97._0_4_;
  auVar200._8_4_ = auVar97._0_4_;
  auVar200._12_4_ = auVar97._0_4_;
  auVar203 = ZEXT1664(auVar200);
  auVar117 = vshufps_avx(auVar97,auVar97,0x55);
  auVar98 = vshufps_avx(auVar97,auVar97,0xaa);
  fVar129 = auVar98._0_4_;
  auVar153._0_4_ = fVar129 * auVar102._0_4_;
  fVar110 = auVar98._4_4_;
  auVar153._4_4_ = fVar110 * auVar102._4_4_;
  fVar111 = auVar98._8_4_;
  auVar153._8_4_ = fVar111 * auVar102._8_4_;
  fVar112 = auVar98._12_4_;
  auVar153._12_4_ = fVar112 * auVar102._12_4_;
  auVar116._0_4_ = auVar19._0_4_ * fVar129;
  auVar116._4_4_ = auVar19._4_4_ * fVar110;
  auVar116._8_4_ = auVar19._8_4_ * fVar111;
  auVar116._12_4_ = auVar19._12_4_ * fVar112;
  auVar98._0_4_ = auVar130._0_4_ * fVar129;
  auVar98._4_4_ = auVar130._4_4_ * fVar110;
  auVar98._8_4_ = auVar130._8_4_ * fVar111;
  auVar98._12_4_ = auVar130._12_4_ * fVar112;
  auVar16 = vfmadd231ps_fma(auVar153,auVar117,auVar16);
  auVar102 = vfmadd231ps_fma(auVar116,auVar117,auVar18);
  auVar18 = vfmadd231ps_fma(auVar98,auVar117,auVar99);
  auVar19 = vfmadd231ps_fma(auVar16,auVar200,auVar20);
  auVar99 = vfmadd231ps_fma(auVar102,auVar200,auVar17);
  local_290._8_4_ = 0x7fffffff;
  local_290._0_8_ = 0x7fffffff7fffffff;
  local_290._12_4_ = 0x7fffffff;
  auVar130 = vfmadd231ps_fma(auVar18,auVar200,auVar100);
  auVar20 = vandps_avx(auVar140,local_290);
  auVar145._8_4_ = 0x219392ef;
  auVar145._0_8_ = 0x219392ef219392ef;
  auVar145._12_4_ = 0x219392ef;
  auVar20 = vcmpps_avx(auVar20,auVar145,1);
  auVar16 = vblendvps_avx(auVar140,auVar145,auVar20);
  auVar20 = vandps_avx(auVar118,local_290);
  auVar20 = vcmpps_avx(auVar20,auVar145,1);
  auVar102 = vblendvps_avx(auVar118,auVar145,auVar20);
  auVar20 = vandps_avx(local_290,auVar146);
  auVar20 = vcmpps_avx(auVar20,auVar145,1);
  auVar20 = vblendvps_avx(auVar146,auVar145,auVar20);
  auVar17 = vrcpps_avx(auVar16);
  auVar169._8_4_ = 0x3f800000;
  auVar169._0_8_ = 0x3f8000003f800000;
  auVar169._12_4_ = 0x3f800000;
  auVar16 = vfnmadd213ps_fma(auVar16,auVar17,auVar169);
  auVar17 = vfmadd132ps_fma(auVar16,auVar17,auVar17);
  auVar16 = vrcpps_avx(auVar102);
  auVar102 = vfnmadd213ps_fma(auVar102,auVar16,auVar169);
  auVar18 = vfmadd132ps_fma(auVar102,auVar16,auVar16);
  auVar16 = vrcpps_avx(auVar20);
  auVar20 = vfnmadd213ps_fma(auVar20,auVar16,auVar169);
  auVar100 = vfmadd132ps_fma(auVar20,auVar16,auVar16);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar89 * 7 + 6);
  auVar20 = vpmovsxwd_avx(auVar20);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar102 = vsubps_avx(auVar20,auVar19);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar89 * 9 + 6);
  auVar20 = vpmovsxwd_avx(auVar16);
  auVar146._0_4_ = auVar17._0_4_ * auVar102._0_4_;
  auVar146._4_4_ = auVar17._4_4_ * auVar102._4_4_;
  auVar146._8_4_ = auVar17._8_4_ * auVar102._8_4_;
  auVar146._12_4_ = auVar17._12_4_ * auVar102._12_4_;
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar20 = vsubps_avx(auVar20,auVar19);
  auVar154._0_4_ = auVar17._0_4_ * auVar20._0_4_;
  auVar154._4_4_ = auVar17._4_4_ * auVar20._4_4_;
  auVar154._8_4_ = auVar17._8_4_ * auVar20._8_4_;
  auVar154._12_4_ = auVar17._12_4_ * auVar20._12_4_;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *(ulong *)(prim + uVar89 * 0xe + 6);
  auVar20 = vpmovsxwd_avx(auVar102);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar16 = vsubps_avx(auVar20,auVar99);
  auVar118._1_3_ = 0;
  auVar118[0] = PVar10;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar10 * 0x10 + 6);
  auVar20 = vpmovsxwd_avx(auVar17);
  auVar160._0_4_ = auVar18._0_4_ * auVar16._0_4_;
  auVar160._4_4_ = auVar18._4_4_ * auVar16._4_4_;
  auVar160._8_4_ = auVar18._8_4_ * auVar16._8_4_;
  auVar160._12_4_ = auVar18._12_4_ * auVar16._12_4_;
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar20 = vsubps_avx(auVar20,auVar99);
  auVar117._0_4_ = auVar18._0_4_ * auVar20._0_4_;
  auVar117._4_4_ = auVar18._4_4_ * auVar20._4_4_;
  auVar117._8_4_ = auVar18._8_4_ * auVar20._8_4_;
  auVar117._12_4_ = auVar18._12_4_ * auVar20._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar89 * 0x15 + 6);
  auVar20 = vpmovsxwd_avx(auVar18);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar20 = vsubps_avx(auVar20,auVar130);
  auVar140._0_4_ = auVar100._0_4_ * auVar20._0_4_;
  auVar140._4_4_ = auVar100._4_4_ * auVar20._4_4_;
  auVar140._8_4_ = auVar100._8_4_ * auVar20._8_4_;
  auVar140._12_4_ = auVar100._12_4_ * auVar20._12_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar89 * 0x17 + 6);
  auVar20 = vpmovsxwd_avx(auVar19);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar20 = vsubps_avx(auVar20,auVar130);
  auVar99._0_4_ = auVar100._0_4_ * auVar20._0_4_;
  auVar99._4_4_ = auVar100._4_4_ * auVar20._4_4_;
  auVar99._8_4_ = auVar100._8_4_ * auVar20._8_4_;
  auVar99._12_4_ = auVar100._12_4_ * auVar20._12_4_;
  auVar20 = vpminsd_avx(auVar146,auVar154);
  auVar16 = vpminsd_avx(auVar160,auVar117);
  auVar20 = vmaxps_avx(auVar20,auVar16);
  auVar16 = vpminsd_avx(auVar140,auVar99);
  uVar94 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar176._4_4_ = uVar94;
  auVar176._0_4_ = uVar94;
  auVar176._8_4_ = uVar94;
  auVar176._12_4_ = uVar94;
  auVar183 = ZEXT1664(auVar176);
  auVar16 = vmaxps_avx(auVar16,auVar176);
  auVar20 = vmaxps_avx(auVar20,auVar16);
  local_2a0._0_4_ = auVar20._0_4_ * 0.99999964;
  local_2a0._4_4_ = auVar20._4_4_ * 0.99999964;
  local_2a0._8_4_ = auVar20._8_4_ * 0.99999964;
  local_2a0._12_4_ = auVar20._12_4_ * 0.99999964;
  auVar20 = vpmaxsd_avx(auVar146,auVar154);
  auVar16 = vpmaxsd_avx(auVar160,auVar117);
  auVar20 = vminps_avx(auVar20,auVar16);
  auVar16 = vpmaxsd_avx(auVar140,auVar99);
  fVar129 = ray->tfar;
  auVar130._4_4_ = fVar129;
  auVar130._0_4_ = fVar129;
  auVar130._8_4_ = fVar129;
  auVar130._12_4_ = fVar129;
  auVar16 = vminps_avx(auVar16,auVar130);
  auVar20 = vminps_avx(auVar20,auVar16);
  auVar100._0_4_ = auVar20._0_4_ * 1.0000004;
  auVar100._4_4_ = auVar20._4_4_ * 1.0000004;
  auVar100._8_4_ = auVar20._8_4_ * 1.0000004;
  auVar100._12_4_ = auVar20._12_4_ * 1.0000004;
  auVar118[4] = PVar10;
  auVar118._5_3_ = 0;
  auVar118[8] = PVar10;
  auVar118._9_3_ = 0;
  auVar118[0xc] = PVar10;
  auVar118._13_3_ = 0;
  auVar16 = vpcmpgtd_avx(auVar118,_DAT_01f4ad30);
  auVar20 = vcmpps_avx(local_2a0,auVar100,2);
  auVar20 = vandps_avx(auVar20,auVar16);
  local_480 = mm_lookupmask_ps._16_8_;
  uStack_478 = mm_lookupmask_ps._24_8_;
  uStack_470 = mm_lookupmask_ps._16_8_;
  uStack_468 = mm_lookupmask_ps._24_8_;
  uVar94 = vmovmskps_avx(auVar20);
  local_488 = CONCAT44((int)((ulong)unaff_R14 >> 0x20),uVar94);
  local_788 = prim;
  while (auVar126 = local_3c0, local_488 != 0) {
    auVar125 = auVar197._0_32_;
    auVar186 = auVar187._0_32_;
    local_6c0 = auVar183._0_32_;
    local_680 = auVar190._0_32_;
    lVar92 = 0;
    for (uVar89 = local_488; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x8000000000000000) {
      lVar92 = lVar92 + 1;
    }
    local_710 = (ulong)*(uint *)(local_788 + 2);
    pGVar12 = (context->scene->geometries).items[*(uint *)(local_788 + 2)].ptr;
    local_4a8 = (ulong)*(uint *)(local_788 + lVar92 * 4 + 6);
    uVar89 = (ulong)*(uint *)(*(long *)&pGVar12->field_0x58 +
                             pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i * (ulong)*(uint *)(local_788 + lVar92 * 4 + 6));
    p_Var13 = pGVar12[1].intersectionFilterN;
    lVar92 = *(long *)&pGVar12[1].time_range.upper;
    pauVar1 = (undefined1 (*) [16])(lVar92 + (long)p_Var13 * uVar89);
    local_5e0 = *(undefined8 *)*pauVar1;
    uStack_5d8 = *(undefined8 *)(*pauVar1 + 8);
    pauVar2 = (undefined1 (*) [16])(lVar92 + (uVar89 + 1) * (long)p_Var13);
    local_5f0 = *(undefined8 *)*pauVar2;
    uStack_5e8 = *(undefined8 *)(*pauVar2 + 8);
    pauVar3 = (undefined1 (*) [16])(lVar92 + (uVar89 + 2) * (long)p_Var13);
    local_600 = *(undefined8 *)*pauVar3;
    uStack_5f8 = *(undefined8 *)(*pauVar3 + 8);
    uVar95 = local_488 - 1 & local_488;
    pauVar4 = (undefined1 (*) [12])(lVar92 + (uVar89 + 3) * (long)p_Var13);
    local_4a0 = (float)*(undefined8 *)*pauVar4;
    fStack_49c = (float)((ulong)*(undefined8 *)*pauVar4 >> 0x20);
    fStack_498 = (float)*(undefined8 *)(*pauVar4 + 8);
    fStack_494 = (float)((ulong)*(undefined8 *)(*pauVar4 + 8) >> 0x20);
    if (uVar95 != 0) {
      uVar91 = uVar95 - 1 & uVar95;
      for (uVar89 = uVar95; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x8000000000000000) {
      }
      if (uVar91 != 0) {
        for (; (uVar91 & 1) == 0; uVar91 = uVar91 >> 1 | 0x8000000000000000) {
        }
      }
    }
    iVar11 = (int)pGVar12[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    aVar7 = (ray->org).field_0;
    auVar16 = vsubps_avx(*pauVar1,(undefined1  [16])aVar7);
    uVar94 = auVar16._0_4_;
    auVar141._4_4_ = uVar94;
    auVar141._0_4_ = uVar94;
    auVar141._8_4_ = uVar94;
    auVar141._12_4_ = uVar94;
    auVar20 = vshufps_avx(auVar16,auVar16,0x55);
    auVar16 = vshufps_avx(auVar16,auVar16,0xaa);
    aVar8 = (local_708->ray_space).vx.field_0;
    aVar9 = (local_708->ray_space).vy.field_0;
    fVar129 = (local_708->ray_space).vz.field_0.m128[0];
    fVar110 = (local_708->ray_space).vz.field_0.m128[1];
    fVar111 = (local_708->ray_space).vz.field_0.m128[2];
    fVar112 = (local_708->ray_space).vz.field_0.m128[3];
    auVar155._0_4_ = auVar16._0_4_ * fVar129;
    auVar155._4_4_ = auVar16._4_4_ * fVar110;
    auVar155._8_4_ = auVar16._8_4_ * fVar111;
    auVar155._12_4_ = auVar16._12_4_ * fVar112;
    auVar20 = vfmadd231ps_fma(auVar155,(undefined1  [16])aVar9,auVar20);
    auVar19 = vfmadd231ps_fma(auVar20,(undefined1  [16])aVar8,auVar141);
    auVar20 = vblendps_avx(auVar19,*pauVar1,8);
    auVar102 = vsubps_avx(*pauVar2,(undefined1  [16])aVar7);
    uVar94 = auVar102._0_4_;
    auVar156._4_4_ = uVar94;
    auVar156._0_4_ = uVar94;
    auVar156._8_4_ = uVar94;
    auVar156._12_4_ = uVar94;
    auVar16 = vshufps_avx(auVar102,auVar102,0x55);
    auVar102 = vshufps_avx(auVar102,auVar102,0xaa);
    auVar185._0_4_ = auVar102._0_4_ * fVar129;
    auVar185._4_4_ = auVar102._4_4_ * fVar110;
    auVar185._8_4_ = auVar102._8_4_ * fVar111;
    auVar185._12_4_ = auVar102._12_4_ * fVar112;
    auVar16 = vfmadd231ps_fma(auVar185,(undefined1  [16])aVar9,auVar16);
    auVar100 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar8,auVar156);
    auVar16 = vblendps_avx(auVar100,*pauVar2,8);
    auVar17 = vsubps_avx(*pauVar3,(undefined1  [16])aVar7);
    uVar94 = auVar17._0_4_;
    auVar161._4_4_ = uVar94;
    auVar161._0_4_ = uVar94;
    auVar161._8_4_ = uVar94;
    auVar161._12_4_ = uVar94;
    auVar102 = vshufps_avx(auVar17,auVar17,0x55);
    auVar17 = vshufps_avx(auVar17,auVar17,0xaa);
    auVar191._0_4_ = auVar17._0_4_ * fVar129;
    auVar191._4_4_ = auVar17._4_4_ * fVar110;
    auVar191._8_4_ = auVar17._8_4_ * fVar111;
    auVar191._12_4_ = auVar17._12_4_ * fVar112;
    auVar102 = vfmadd231ps_fma(auVar191,(undefined1  [16])aVar9,auVar102);
    auVar99 = vfmadd231ps_fma(auVar102,(undefined1  [16])aVar8,auVar161);
    auVar102 = vblendps_avx(auVar99,*pauVar3,8);
    auVar82._12_4_ = fStack_494;
    auVar82._0_12_ = *pauVar4;
    auVar18 = vsubps_avx(auVar82,(undefined1  [16])aVar7);
    uVar94 = auVar18._0_4_;
    auVar170._4_4_ = uVar94;
    auVar170._0_4_ = uVar94;
    auVar170._8_4_ = uVar94;
    auVar170._12_4_ = uVar94;
    auVar17 = vshufps_avx(auVar18,auVar18,0x55);
    auVar18 = vshufps_avx(auVar18,auVar18,0xaa);
    auVar196._0_4_ = auVar18._0_4_ * fVar129;
    auVar196._4_4_ = auVar18._4_4_ * fVar110;
    auVar196._8_4_ = auVar18._8_4_ * fVar111;
    auVar196._12_4_ = auVar18._12_4_ * fVar112;
    auVar17 = vfmadd231ps_fma(auVar196,(undefined1  [16])aVar9,auVar17);
    auVar130 = vfmadd231ps_fma(auVar17,(undefined1  [16])aVar8,auVar170);
    auVar17 = vblendps_avx(auVar130,auVar82,8);
    auVar20 = vandps_avx(auVar20,local_290);
    auVar16 = vandps_avx(auVar16,local_290);
    auVar18 = vmaxps_avx(auVar20,auVar16);
    auVar20 = vandps_avx(auVar102,local_290);
    auVar16 = vandps_avx(auVar17,local_290);
    auVar20 = vmaxps_avx(auVar20,auVar16);
    auVar20 = vmaxps_avx(auVar18,auVar20);
    auVar16 = vmovshdup_avx(auVar20);
    auVar16 = vmaxss_avx(auVar16,auVar20);
    auVar20 = vshufpd_avx(auVar20,auVar20,1);
    auVar20 = vmaxss_avx(auVar20,auVar16);
    local_790 = (long)iVar11;
    lVar92 = local_790 * 0x44;
    auVar16 = vmovshdup_avx(auVar19);
    uVar96 = auVar16._0_8_;
    local_460._8_8_ = uVar96;
    local_460._0_8_ = uVar96;
    local_460._16_8_ = uVar96;
    local_460._24_8_ = uVar96;
    auVar16 = vmovshdup_avx(auVar100);
    uVar96 = auVar16._0_8_;
    local_640._8_8_ = uVar96;
    local_640._0_8_ = uVar96;
    local_640._16_8_ = uVar96;
    local_640._24_8_ = uVar96;
    auVar137 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar92 + 0x908);
    local_6a0._0_4_ = auVar99._0_4_;
    local_6a0._4_4_ = local_6a0._0_4_;
    local_6a0._8_4_ = local_6a0._0_4_;
    local_6a0._12_4_ = local_6a0._0_4_;
    local_6a0._16_4_ = local_6a0._0_4_;
    local_6a0._20_4_ = local_6a0._0_4_;
    local_6a0._24_4_ = local_6a0._0_4_;
    local_6a0._28_4_ = local_6a0._0_4_;
    auVar16 = vmovshdup_avx(auVar99);
    uVar96 = auVar16._0_8_;
    local_5a0._8_8_ = uVar96;
    local_5a0._0_8_ = uVar96;
    local_5a0._16_8_ = uVar96;
    local_5a0._24_8_ = uVar96;
    fVar112 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar92 + 0xd8c);
    fVar204 = *(float *)(catmullrom_basis0 + lVar92 + 0xd90);
    fVar71 = *(float *)(catmullrom_basis0 + lVar92 + 0xd94);
    fVar72 = *(float *)(catmullrom_basis0 + lVar92 + 0xd98);
    fVar73 = *(float *)(catmullrom_basis0 + lVar92 + 0xd9c);
    fVar74 = *(float *)(catmullrom_basis0 + lVar92 + 0xda0);
    fVar75 = *(float *)(catmullrom_basis0 + lVar92 + 0xda4);
    auVar86 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar92 + 0xd8c);
    local_560 = auVar130._0_4_;
    auVar16 = vmovshdup_avx(auVar130);
    auVar183._0_4_ = fVar112 * local_560;
    auVar183._4_4_ = fVar204 * local_560;
    auVar183._8_4_ = fVar71 * local_560;
    auVar183._12_4_ = fVar72 * local_560;
    auVar183._16_4_ = fVar73 * local_560;
    auVar183._20_4_ = fVar74 * local_560;
    auVar183._28_36_ = auVar203._28_36_;
    auVar183._24_4_ = fVar75 * local_560;
    local_580 = auVar16._0_4_;
    auVar103._0_4_ = fVar112 * local_580;
    fStack_57c = auVar16._4_4_;
    auVar103._4_4_ = fVar204 * fStack_57c;
    auVar103._8_4_ = fVar71 * local_580;
    auVar103._12_4_ = fVar72 * fStack_57c;
    auVar103._16_4_ = fVar73 * local_580;
    auVar103._20_4_ = fVar74 * fStack_57c;
    auVar103._24_4_ = fVar75 * local_580;
    auVar103._28_4_ = 0;
    auVar102 = vfmadd231ps_fma(auVar183._0_32_,auVar137,local_6a0);
    auVar17 = vfmadd231ps_fma(auVar103,auVar137,local_5a0);
    auVar103 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar92 + 0x484);
    uVar94 = auVar100._0_4_;
    local_620._4_4_ = uVar94;
    local_620._0_4_ = uVar94;
    local_620._8_4_ = uVar94;
    local_620._12_4_ = uVar94;
    local_620._16_4_ = uVar94;
    local_620._20_4_ = uVar94;
    local_620._24_4_ = uVar94;
    local_620._28_4_ = uVar94;
    auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar103,local_620);
    auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar103,local_640);
    auVar182 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar92);
    uVar94 = auVar19._0_4_;
    local_500._4_4_ = uVar94;
    local_500._0_4_ = uVar94;
    local_500._8_4_ = uVar94;
    local_500._12_4_ = uVar94;
    local_500._16_4_ = uVar94;
    local_500._20_4_ = uVar94;
    local_500._24_4_ = uVar94;
    local_500._28_4_ = uVar94;
    auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar182,local_500);
    auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar182,local_460);
    auVar136 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar92 + 0x908);
    local_340 = *(float *)(catmullrom_basis1 + lVar92 + 0xd8c);
    fStack_33c = *(float *)(catmullrom_basis1 + lVar92 + 0xd90);
    fStack_338 = *(float *)(catmullrom_basis1 + lVar92 + 0xd94);
    fStack_334 = *(float *)(catmullrom_basis1 + lVar92 + 0xd98);
    fStack_330 = *(float *)(catmullrom_basis1 + lVar92 + 0xd9c);
    fStack_32c = *(float *)(catmullrom_basis1 + lVar92 + 0xda0);
    fStack_328 = *(float *)(catmullrom_basis1 + lVar92 + 0xda4);
    fStack_55c = local_560;
    fStack_558 = local_560;
    fStack_554 = local_560;
    fStack_550 = local_560;
    fStack_54c = local_560;
    fStack_548 = local_560;
    fStack_544 = local_560;
    auVar109._4_4_ = fStack_33c * local_560;
    auVar109._0_4_ = local_340 * local_560;
    auVar109._8_4_ = fStack_338 * local_560;
    auVar109._12_4_ = fStack_334 * local_560;
    auVar109._16_4_ = fStack_330 * local_560;
    auVar109._20_4_ = fStack_32c * local_560;
    auVar109._24_4_ = fStack_328 * local_560;
    auVar109._28_4_ = local_560;
    auVar18 = vfmadd231ps_fma(auVar109,auVar136,local_6a0);
    auVar178._4_4_ = fStack_33c * fStack_57c;
    auVar178._0_4_ = local_340 * local_580;
    auVar178._8_4_ = fStack_338 * local_580;
    auVar178._12_4_ = fStack_334 * fStack_57c;
    auVar178._16_4_ = fStack_330 * local_580;
    auVar178._20_4_ = fStack_32c * fStack_57c;
    auVar178._24_4_ = fStack_328 * local_580;
    auVar178._28_4_ = fStack_57c;
    auVar117 = vfmadd231ps_fma(auVar178,auVar136,local_5a0);
    auVar109 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar92 + 0x484);
    auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar109,local_620);
    auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),auVar109,local_640);
    auVar178 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar92);
    auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar178,local_500);
    auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),auVar178,local_460);
    local_2e0 = ZEXT1632(auVar18);
    local_320 = ZEXT1632(auVar102);
    auVar21 = vsubps_avx(local_2e0,local_320);
    local_300 = ZEXT1632(auVar117);
    auVar104 = ZEXT1632(auVar17);
    auVar22 = vsubps_avx(local_300,auVar104);
    auVar105._0_4_ = auVar17._0_4_ * auVar21._0_4_;
    auVar105._4_4_ = auVar17._4_4_ * auVar21._4_4_;
    auVar105._8_4_ = auVar17._8_4_ * auVar21._8_4_;
    auVar105._12_4_ = auVar17._12_4_ * auVar21._12_4_;
    auVar105._16_4_ = auVar21._16_4_ * 0.0;
    auVar105._20_4_ = auVar21._20_4_ * 0.0;
    auVar105._24_4_ = auVar21._24_4_ * 0.0;
    auVar105._28_4_ = 0;
    fVar129 = auVar22._0_4_;
    auVar119._0_4_ = auVar102._0_4_ * fVar129;
    fVar111 = auVar22._4_4_;
    auVar119._4_4_ = auVar102._4_4_ * fVar111;
    fVar113 = auVar22._8_4_;
    auVar119._8_4_ = auVar102._8_4_ * fVar113;
    fVar114 = auVar22._12_4_;
    auVar119._12_4_ = auVar102._12_4_ * fVar114;
    fVar115 = auVar22._16_4_;
    auVar119._16_4_ = fVar115 * 0.0;
    fVar15 = auVar22._20_4_;
    auVar119._20_4_ = fVar15 * 0.0;
    fVar198 = auVar22._24_4_;
    auVar119._24_4_ = fVar198 * 0.0;
    auVar119._28_4_ = 0;
    auVar105 = vsubps_avx(auVar105,auVar119);
    auVar102 = vpermilps_avx(*pauVar1,0xff);
    uVar96 = auVar102._0_8_;
    local_80._8_8_ = uVar96;
    local_80._0_8_ = uVar96;
    local_80._16_8_ = uVar96;
    local_80._24_8_ = uVar96;
    auVar17 = vpermilps_avx(*pauVar2,0xff);
    uVar96 = auVar17._0_8_;
    local_a0._8_8_ = uVar96;
    local_a0._0_8_ = uVar96;
    local_a0._16_8_ = uVar96;
    local_a0._24_8_ = uVar96;
    auVar17 = vpermilps_avx(*pauVar3,0xff);
    uVar96 = auVar17._0_8_;
    local_c0._8_8_ = uVar96;
    local_c0._0_8_ = uVar96;
    local_c0._16_8_ = uVar96;
    local_c0._24_8_ = uVar96;
    auVar83._12_4_ = fStack_494;
    auVar83._0_12_ = *pauVar4;
    auVar17 = vpermilps_avx(auVar83,0xff);
    local_e0 = auVar17._0_8_;
    fVar110 = auVar17._0_4_;
    auVar162._0_4_ = fVar112 * fVar110;
    fVar112 = auVar17._4_4_;
    auVar162._4_4_ = fVar204 * fVar112;
    auVar162._8_4_ = fVar71 * fVar110;
    auVar162._12_4_ = fVar72 * fVar112;
    auVar162._16_4_ = fVar73 * fVar110;
    auVar162._20_4_ = fVar74 * fVar112;
    auVar162._24_4_ = fVar75 * fVar110;
    auVar162._28_4_ = 0;
    auVar17 = vfmadd231ps_fma(auVar162,local_c0,auVar137);
    auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar103,local_a0);
    auVar18 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar182,local_80);
    uStack_d8 = local_e0;
    uStack_d0 = local_e0;
    uStack_c8 = local_e0;
    iStack_324 = *(undefined4 *)(catmullrom_basis1 + lVar92 + 0xda8);
    auVar14._4_4_ = fStack_33c * fVar112;
    auVar14._0_4_ = local_340 * fVar110;
    auVar14._8_4_ = fStack_338 * fVar110;
    auVar14._12_4_ = fStack_334 * fVar112;
    auVar14._16_4_ = fStack_330 * fVar110;
    auVar14._20_4_ = fStack_32c * fVar112;
    auVar14._24_4_ = fStack_328 * fVar110;
    auVar14._28_4_ = auVar182._28_4_;
    auVar17 = vfmadd231ps_fma(auVar14,auVar136,local_c0);
    auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar109,local_a0);
    auVar117 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar178,local_80);
    auVar24._4_4_ = fVar111 * fVar111;
    auVar24._0_4_ = fVar129 * fVar129;
    auVar24._8_4_ = fVar113 * fVar113;
    auVar24._12_4_ = fVar114 * fVar114;
    auVar24._16_4_ = fVar115 * fVar115;
    auVar24._20_4_ = fVar15 * fVar15;
    auVar24._24_4_ = fVar198 * fVar198;
    auVar24._28_4_ = auVar102._4_4_;
    auVar102 = vfmadd231ps_fma(auVar24,auVar21,auVar21);
    auVar14 = vmaxps_avx(ZEXT1632(auVar18),ZEXT1632(auVar117));
    auVar23._4_4_ = auVar102._4_4_ * auVar14._4_4_ * auVar14._4_4_;
    auVar23._0_4_ = auVar102._0_4_ * auVar14._0_4_ * auVar14._0_4_;
    auVar23._8_4_ = auVar102._8_4_ * auVar14._8_4_ * auVar14._8_4_;
    auVar23._12_4_ = auVar102._12_4_ * auVar14._12_4_ * auVar14._12_4_;
    auVar23._16_4_ = auVar14._16_4_ * auVar14._16_4_ * 0.0;
    auVar23._20_4_ = auVar14._20_4_ * auVar14._20_4_ * 0.0;
    auVar23._24_4_ = auVar14._24_4_ * auVar14._24_4_ * 0.0;
    auVar23._28_4_ = auVar14._28_4_;
    auVar26._4_4_ = auVar105._4_4_ * auVar105._4_4_;
    auVar26._0_4_ = auVar105._0_4_ * auVar105._0_4_;
    auVar26._8_4_ = auVar105._8_4_ * auVar105._8_4_;
    auVar26._12_4_ = auVar105._12_4_ * auVar105._12_4_;
    auVar26._16_4_ = auVar105._16_4_ * auVar105._16_4_;
    auVar26._20_4_ = auVar105._20_4_ * auVar105._20_4_;
    auVar26._24_4_ = auVar105._24_4_ * auVar105._24_4_;
    auVar26._28_4_ = auVar105._28_4_;
    auVar14 = vcmpps_avx(auVar26,auVar23,2);
    fVar129 = auVar20._0_4_ * 4.7683716e-07;
    auVar120._0_4_ = (float)iVar11;
    local_3c0._4_12_ = auVar130._4_12_;
    local_3c0._0_4_ = auVar120._0_4_;
    local_3c0._16_16_ = auVar126._16_16_;
    auVar120._4_4_ = auVar120._0_4_;
    auVar120._8_4_ = auVar120._0_4_;
    auVar120._12_4_ = auVar120._0_4_;
    auVar120._16_4_ = auVar120._0_4_;
    auVar120._20_4_ = auVar120._0_4_;
    auVar120._24_4_ = auVar120._0_4_;
    auVar120._28_4_ = auVar120._0_4_;
    auVar126 = vcmpps_avx(_DAT_01f7b060,auVar120,1);
    auVar102 = vpermilps_avx(auVar19,0xaa);
    uVar96 = auVar102._0_8_;
    local_440._8_8_ = uVar96;
    local_440._0_8_ = uVar96;
    local_440._16_8_ = uVar96;
    local_440._24_8_ = uVar96;
    auVar17 = vpermilps_avx(auVar100,0xaa);
    uVar96 = auVar17._0_8_;
    local_100._8_8_ = uVar96;
    local_100._0_8_ = uVar96;
    local_100._16_8_ = uVar96;
    local_100._24_8_ = uVar96;
    auVar20 = vpermilps_avx(auVar99,0xaa);
    uVar96 = auVar20._0_8_;
    local_2c0._8_8_ = uVar96;
    local_2c0._0_8_ = uVar96;
    local_2c0._16_8_ = uVar96;
    local_2c0._24_8_ = uVar96;
    auVar20 = vshufps_avx(auVar130,auVar130,0xaa);
    uVar96 = auVar20._0_8_;
    register0x00001588 = uVar96;
    local_540 = uVar96;
    register0x00001590 = uVar96;
    register0x00001598 = uVar96;
    auVar105 = auVar126 & auVar14;
    local_520._0_16_ = vpermilps_avx((undefined1  [16])aVar7,0xff);
    auVar24 = local_520;
    local_740._0_16_ = ZEXT416((uint)fVar129);
    fStack_578 = local_580;
    fStack_574 = fStack_57c;
    fStack_570 = local_580;
    fStack_56c = fStack_57c;
    fStack_568 = local_580;
    fStack_564 = fStack_57c;
    local_520 = auVar24;
    if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar105 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar105 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar105 >> 0x7f,0) == '\0') &&
          (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar105 >> 0xbf,0) == '\0') &&
        (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar105[0x1f])
    {
      auVar187 = ZEXT3264(auVar186);
      auVar197 = ZEXT3264(auVar125);
LAB_0117611f:
      auVar203 = ZEXT3264(_local_540);
      auVar195 = ZEXT3264(local_6a0);
      auVar190 = ZEXT3264(local_680);
      auVar183 = ZEXT3264(local_6c0);
      auVar205 = ZEXT3264(local_5a0);
      bVar93 = 0;
      auVar167 = ZEXT3264(CONCAT428(local_560,
                                    CONCAT424(local_560,
                                              CONCAT420(local_560,
                                                        CONCAT416(local_560,
                                                                  CONCAT412(local_560,
                                                                            CONCAT48(local_560,
                                                                                     CONCAT44(
                                                  local_560,local_560))))))));
      auVar171 = ZEXT3264(CONCAT428(fStack_57c,
                                    CONCAT424(local_580,
                                              CONCAT420(fStack_57c,
                                                        CONCAT416(local_580,
                                                                  CONCAT412(fStack_57c,
                                                                            CONCAT48(local_580,
                                                                                     auVar16._0_8_))
                                                                 )))));
      auVar174 = ZEXT3264(local_620);
      auVar144 = ZEXT3264(local_500);
    }
    else {
      local_360 = vandps_avx(auVar126,auVar14);
      fVar198 = auVar20._0_4_;
      fVar204 = auVar20._4_4_;
      auVar126._4_4_ = fVar204 * fStack_33c;
      auVar126._0_4_ = fVar198 * local_340;
      auVar126._8_4_ = fVar198 * fStack_338;
      auVar126._12_4_ = fVar204 * fStack_334;
      auVar126._16_4_ = fVar198 * fStack_330;
      auVar126._20_4_ = fVar204 * fStack_32c;
      auVar126._24_4_ = fVar198 * fStack_328;
      auVar126._28_4_ = local_360._28_4_;
      auVar20 = vfmadd213ps_fma(auVar136,local_2c0,auVar126);
      auVar20 = vfmadd213ps_fma(auVar109,local_100,ZEXT1632(auVar20));
      auVar20 = vfmadd213ps_fma(auVar178,local_440,ZEXT1632(auVar20));
      local_420._0_4_ = auVar86._0_4_;
      local_420._4_4_ = auVar86._4_4_;
      fStack_418 = auVar86._8_4_;
      fStack_414 = auVar86._12_4_;
      fStack_410 = auVar86._16_4_;
      fStack_40c = auVar86._20_4_;
      fStack_408 = auVar86._24_4_;
      auVar106._0_4_ = fVar198 * (float)local_420._0_4_;
      auVar106._4_4_ = fVar204 * (float)local_420._4_4_;
      auVar106._8_4_ = fVar198 * fStack_418;
      auVar106._12_4_ = fVar204 * fStack_414;
      auVar106._16_4_ = fVar198 * fStack_410;
      auVar106._20_4_ = fVar204 * fStack_40c;
      auVar106._24_4_ = fVar198 * fStack_408;
      auVar106._28_4_ = 0;
      auVar19 = vfmadd213ps_fma(auVar137,local_2c0,auVar106);
      auVar19 = vfmadd213ps_fma(auVar103,local_100,ZEXT1632(auVar19));
      auVar126 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar92 + 0x1210);
      auVar137 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar92 + 0x1694);
      auVar103 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar92 + 0x1b18);
      fVar110 = *(float *)(catmullrom_basis0 + lVar92 + 0x1f9c);
      fVar111 = *(float *)(catmullrom_basis0 + lVar92 + 0x1fa0);
      fVar112 = *(float *)(catmullrom_basis0 + lVar92 + 0x1fa4);
      fVar113 = *(float *)(catmullrom_basis0 + lVar92 + 0x1fa8);
      fVar114 = *(float *)(catmullrom_basis0 + lVar92 + 0x1fac);
      fVar115 = *(float *)(catmullrom_basis0 + lVar92 + 0x1fb0);
      fVar15 = *(float *)(catmullrom_basis0 + lVar92 + 0x1fb4);
      auVar135._0_4_ = local_560 * fVar110;
      auVar135._4_4_ = local_560 * fVar111;
      auVar135._8_4_ = local_560 * fVar112;
      auVar135._12_4_ = local_560 * fVar113;
      auVar135._16_4_ = local_560 * fVar114;
      auVar135._20_4_ = local_560 * fVar115;
      auVar135._24_4_ = local_560 * fVar15;
      auVar135._28_4_ = 0;
      _local_420 = auVar21;
      auVar136._4_4_ = fStack_57c * fVar111;
      auVar136._0_4_ = local_580 * fVar110;
      auVar136._8_4_ = local_580 * fVar112;
      auVar136._12_4_ = fStack_57c * fVar113;
      auVar136._16_4_ = local_580 * fVar114;
      auVar136._20_4_ = fStack_57c * fVar115;
      auVar136._24_4_ = local_580 * fVar15;
      auVar136._28_4_ = auVar21._28_4_;
      auVar27._4_4_ = fVar204 * fVar111;
      auVar27._0_4_ = fVar198 * fVar110;
      auVar27._8_4_ = fVar198 * fVar112;
      auVar27._12_4_ = fVar204 * fVar113;
      auVar27._16_4_ = fVar198 * fVar114;
      auVar27._20_4_ = fVar204 * fVar115;
      auVar27._24_4_ = fVar198 * fVar15;
      auVar27._28_4_ = *(undefined4 *)(catmullrom_basis0 + lVar92 + 0x1fb8);
      auVar100 = vfmadd231ps_fma(auVar135,auVar103,local_6a0);
      auVar99 = vfmadd231ps_fma(auVar136,auVar103,local_5a0);
      auVar130 = vfmadd231ps_fma(auVar27,local_2c0,auVar103);
      auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar137,local_620);
      auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar137,local_640);
      auVar130 = vfmadd231ps_fma(ZEXT1632(auVar130),local_100,auVar137);
      auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar126,local_500);
      auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar126,local_460);
      auVar130 = vfmadd231ps_fma(ZEXT1632(auVar130),local_440,auVar126);
      fVar110 = *(float *)(catmullrom_basis1 + lVar92 + 0x1f9c);
      fVar111 = *(float *)(catmullrom_basis1 + lVar92 + 0x1fa0);
      fVar112 = *(float *)(catmullrom_basis1 + lVar92 + 0x1fa4);
      fVar113 = *(float *)(catmullrom_basis1 + lVar92 + 0x1fa8);
      fVar114 = *(float *)(catmullrom_basis1 + lVar92 + 0x1fac);
      fVar115 = *(float *)(catmullrom_basis1 + lVar92 + 0x1fb0);
      fVar15 = *(float *)(catmullrom_basis1 + lVar92 + 0x1fb4);
      auVar137._4_4_ = local_560 * fVar111;
      auVar137._0_4_ = local_560 * fVar110;
      auVar137._8_4_ = local_560 * fVar112;
      auVar137._12_4_ = local_560 * fVar113;
      auVar137._16_4_ = local_560 * fVar114;
      auVar137._20_4_ = local_560 * fVar115;
      auVar137._24_4_ = local_560 * fVar15;
      auVar137._28_4_ = auVar103._28_4_;
      auVar28._4_4_ = fStack_57c * fVar111;
      auVar28._0_4_ = local_580 * fVar110;
      auVar28._8_4_ = local_580 * fVar112;
      auVar28._12_4_ = fStack_57c * fVar113;
      auVar28._16_4_ = local_580 * fVar114;
      auVar28._20_4_ = fStack_57c * fVar115;
      auVar28._24_4_ = local_580 * fVar15;
      auVar28._28_4_ = auVar102._4_4_;
      auVar29._4_4_ = fVar111 * fVar204;
      auVar29._0_4_ = fVar110 * fVar198;
      auVar29._8_4_ = fVar112 * fVar198;
      auVar29._12_4_ = fVar113 * fVar204;
      auVar29._16_4_ = fVar114 * fVar198;
      auVar29._20_4_ = fVar115 * fVar204;
      auVar29._24_4_ = fVar15 * fVar198;
      auVar29._28_4_ = local_560;
      auVar126 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar92 + 0x1b18);
      auVar102 = vfmadd231ps_fma(auVar137,auVar126,local_6a0);
      auVar98 = vfmadd231ps_fma(auVar28,auVar126,local_5a0);
      auVar118 = vfmadd231ps_fma(auVar29,local_2c0,auVar126);
      auVar126 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar92 + 0x1694);
      auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar126,local_620);
      auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),auVar126,local_640);
      auVar118 = vfmadd231ps_fma(ZEXT1632(auVar118),local_100,auVar126);
      auVar126 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar92 + 0x1210);
      auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar126,local_500);
      auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),auVar126,local_460);
      auVar121._8_4_ = 0x7fffffff;
      auVar121._0_8_ = 0x7fffffff7fffffff;
      auVar121._12_4_ = 0x7fffffff;
      auVar121._16_4_ = 0x7fffffff;
      auVar121._20_4_ = 0x7fffffff;
      auVar121._24_4_ = 0x7fffffff;
      auVar121._28_4_ = 0x7fffffff;
      auVar118 = vfmadd231ps_fma(ZEXT1632(auVar118),local_440,auVar126);
      auVar126 = vandps_avx(ZEXT1632(auVar100),auVar121);
      auVar137 = vandps_avx(ZEXT1632(auVar99),auVar121);
      auVar137 = vmaxps_avx(auVar126,auVar137);
      auVar126 = vandps_avx(ZEXT1632(auVar130),auVar121);
      auVar126 = vmaxps_avx(auVar137,auVar126);
      auVar177._4_4_ = fVar129;
      auVar177._0_4_ = fVar129;
      auVar177._8_4_ = fVar129;
      auVar177._12_4_ = fVar129;
      auVar177._16_4_ = fVar129;
      auVar177._20_4_ = fVar129;
      auVar177._24_4_ = fVar129;
      auVar177._28_4_ = fVar129;
      auVar126 = vcmpps_avx(auVar126,auVar177,1);
      auVar103 = vblendvps_avx(ZEXT1632(auVar100),auVar21,auVar126);
      auVar136 = vblendvps_avx(ZEXT1632(auVar99),auVar22,auVar126);
      auVar126 = vandps_avx(ZEXT1632(auVar102),auVar121);
      auVar137 = vandps_avx(ZEXT1632(auVar98),auVar121);
      auVar137 = vmaxps_avx(auVar126,auVar137);
      auVar126 = vandps_avx(ZEXT1632(auVar118),auVar121);
      auVar126 = vmaxps_avx(auVar137,auVar126);
      auVar137 = vcmpps_avx(auVar126,auVar177,1);
      auVar126 = vblendvps_avx(ZEXT1632(auVar102),auVar21,auVar137);
      auVar137 = vblendvps_avx(ZEXT1632(auVar98),auVar22,auVar137);
      auVar102 = vfmadd213ps_fma(auVar182,local_440,ZEXT1632(auVar19));
      auVar19 = vfmadd213ps_fma(auVar103,auVar103,ZEXT832(0) << 0x20);
      auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar136,auVar136);
      auVar182 = vrsqrtps_avx(ZEXT1632(auVar19));
      fVar129 = auVar182._0_4_;
      fVar110 = auVar182._4_4_;
      fVar111 = auVar182._8_4_;
      fVar112 = auVar182._12_4_;
      fVar113 = auVar182._16_4_;
      fVar114 = auVar182._20_4_;
      fVar115 = auVar182._24_4_;
      auVar21._4_4_ = fVar110 * fVar110 * fVar110 * auVar19._4_4_ * -0.5;
      auVar21._0_4_ = fVar129 * fVar129 * fVar129 * auVar19._0_4_ * -0.5;
      auVar21._8_4_ = fVar111 * fVar111 * fVar111 * auVar19._8_4_ * -0.5;
      auVar21._12_4_ = fVar112 * fVar112 * fVar112 * auVar19._12_4_ * -0.5;
      auVar21._16_4_ = fVar113 * fVar113 * fVar113 * -0.0;
      auVar21._20_4_ = fVar114 * fVar114 * fVar114 * -0.0;
      auVar21._24_4_ = fVar115 * fVar115 * fVar115 * -0.0;
      auVar21._28_4_ = 0;
      auVar201._8_4_ = 0x3fc00000;
      auVar201._0_8_ = 0x3fc000003fc00000;
      auVar201._12_4_ = 0x3fc00000;
      auVar201._16_4_ = 0x3fc00000;
      auVar201._20_4_ = 0x3fc00000;
      auVar201._24_4_ = 0x3fc00000;
      auVar201._28_4_ = 0x3fc00000;
      auVar19 = vfmadd231ps_fma(auVar21,auVar201,auVar182);
      fVar129 = auVar19._0_4_;
      fVar110 = auVar19._4_4_;
      auVar22._4_4_ = fVar110 * auVar136._4_4_;
      auVar22._0_4_ = fVar129 * auVar136._0_4_;
      fVar111 = auVar19._8_4_;
      auVar22._8_4_ = fVar111 * auVar136._8_4_;
      fVar112 = auVar19._12_4_;
      auVar22._12_4_ = fVar112 * auVar136._12_4_;
      auVar22._16_4_ = auVar136._16_4_ * 0.0;
      auVar22._20_4_ = auVar136._20_4_ * 0.0;
      auVar22._24_4_ = auVar136._24_4_ * 0.0;
      auVar22._28_4_ = 0;
      auVar30._4_4_ = fVar110 * -auVar103._4_4_;
      auVar30._0_4_ = fVar129 * -auVar103._0_4_;
      auVar30._8_4_ = fVar111 * -auVar103._8_4_;
      auVar30._12_4_ = fVar112 * -auVar103._12_4_;
      auVar30._16_4_ = -auVar103._16_4_ * 0.0;
      auVar30._20_4_ = -auVar103._20_4_ * 0.0;
      auVar30._24_4_ = -auVar103._24_4_ * 0.0;
      auVar30._28_4_ = auVar182._28_4_;
      auVar19 = vfmadd213ps_fma(auVar126,auVar126,ZEXT832(0) << 0x20);
      auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar137,auVar137);
      auVar182 = vrsqrtps_avx(ZEXT1632(auVar19));
      auVar31._28_4_ = auVar17._4_4_;
      auVar31._0_28_ =
           ZEXT1628(CONCAT412(fVar112 * 0.0,
                              CONCAT48(fVar111 * 0.0,CONCAT44(fVar110 * 0.0,fVar129 * 0.0))));
      fVar129 = auVar182._0_4_;
      fVar110 = auVar182._4_4_;
      fVar111 = auVar182._8_4_;
      fVar112 = auVar182._12_4_;
      fVar113 = auVar182._16_4_;
      fVar114 = auVar182._20_4_;
      fVar115 = auVar182._24_4_;
      auVar192._0_4_ = fVar129 * fVar129 * fVar129 * auVar19._0_4_ * -0.5;
      auVar192._4_4_ = fVar110 * fVar110 * fVar110 * auVar19._4_4_ * -0.5;
      auVar192._8_4_ = fVar111 * fVar111 * fVar111 * auVar19._8_4_ * -0.5;
      auVar192._12_4_ = fVar112 * fVar112 * fVar112 * auVar19._12_4_ * -0.5;
      auVar192._16_4_ = fVar113 * fVar113 * fVar113 * -0.0;
      auVar192._20_4_ = fVar114 * fVar114 * fVar114 * -0.0;
      auVar192._24_4_ = fVar115 * fVar115 * fVar115 * -0.0;
      auVar192._28_4_ = 0;
      auVar17 = vfmadd231ps_fma(auVar192,auVar201,auVar182);
      fVar129 = auVar17._0_4_;
      auVar188._0_4_ = auVar137._0_4_ * fVar129;
      fVar110 = auVar17._4_4_;
      auVar188._4_4_ = auVar137._4_4_ * fVar110;
      fVar111 = auVar17._8_4_;
      auVar188._8_4_ = auVar137._8_4_ * fVar111;
      fVar112 = auVar17._12_4_;
      auVar188._12_4_ = auVar137._12_4_ * fVar112;
      auVar188._16_4_ = auVar137._16_4_ * 0.0;
      auVar188._20_4_ = auVar137._20_4_ * 0.0;
      auVar188._24_4_ = auVar137._24_4_ * 0.0;
      auVar188._28_4_ = 0;
      auVar182._4_4_ = fVar110 * -auVar126._4_4_;
      auVar182._0_4_ = fVar129 * -auVar126._0_4_;
      auVar182._8_4_ = fVar111 * -auVar126._8_4_;
      auVar182._12_4_ = fVar112 * -auVar126._12_4_;
      auVar182._16_4_ = -auVar126._16_4_ * 0.0;
      auVar182._20_4_ = -auVar126._20_4_ * 0.0;
      auVar182._24_4_ = -auVar126._24_4_ * 0.0;
      auVar182._28_4_ = auVar103._28_4_ ^ 0x80000000;
      auVar32._28_4_ = 0xbf000000;
      auVar32._0_28_ =
           ZEXT1628(CONCAT412(fVar112 * 0.0,
                              CONCAT48(fVar111 * 0.0,CONCAT44(fVar110 * 0.0,fVar129 * 0.0))));
      auVar17 = vfmadd213ps_fma(auVar22,ZEXT1632(auVar18),local_320);
      auVar126 = ZEXT1632(auVar18);
      auVar19 = vfmadd213ps_fma(auVar30,auVar126,auVar104);
      auVar100 = vfmadd213ps_fma(auVar31,auVar126,ZEXT1632(auVar102));
      auVar98 = vfnmadd213ps_fma(auVar22,auVar126,local_320);
      auVar99 = vfmadd213ps_fma(auVar188,ZEXT1632(auVar117),local_2e0);
      auVar118 = vfnmadd213ps_fma(auVar30,auVar126,auVar104);
      auVar126 = ZEXT1632(auVar117);
      auVar130 = vfmadd213ps_fma(auVar182,auVar126,local_300);
      local_3e0 = ZEXT1632(auVar18);
      auVar97 = vfnmadd231ps_fma(ZEXT1632(auVar102),local_3e0,auVar31);
      auVar102 = vfmadd213ps_fma(auVar32,auVar126,ZEXT1632(auVar20));
      auVar140 = vfnmadd213ps_fma(auVar188,auVar126,local_2e0);
      auVar146 = vfnmadd213ps_fma(auVar182,auVar126,local_300);
      local_400 = ZEXT1632(auVar117);
      auVar116 = vfnmadd231ps_fma(ZEXT1632(auVar20),local_400,auVar32);
      auVar126 = vsubps_avx(ZEXT1632(auVar130),ZEXT1632(auVar118));
      auVar137 = vsubps_avx(ZEXT1632(auVar102),ZEXT1632(auVar97));
      auVar104._4_4_ = auVar97._4_4_ * auVar126._4_4_;
      auVar104._0_4_ = auVar97._0_4_ * auVar126._0_4_;
      auVar104._8_4_ = auVar97._8_4_ * auVar126._8_4_;
      auVar104._12_4_ = auVar97._12_4_ * auVar126._12_4_;
      auVar104._16_4_ = auVar126._16_4_ * 0.0;
      auVar104._20_4_ = auVar126._20_4_ * 0.0;
      auVar104._24_4_ = auVar126._24_4_ * 0.0;
      auVar104._28_4_ = 0;
      auVar18 = vfmsub231ps_fma(auVar104,ZEXT1632(auVar118),auVar137);
      auVar33._4_4_ = auVar137._4_4_ * auVar98._4_4_;
      auVar33._0_4_ = auVar137._0_4_ * auVar98._0_4_;
      auVar33._8_4_ = auVar137._8_4_ * auVar98._8_4_;
      auVar33._12_4_ = auVar137._12_4_ * auVar98._12_4_;
      auVar33._16_4_ = auVar137._16_4_ * 0.0;
      auVar33._20_4_ = auVar137._20_4_ * 0.0;
      auVar33._24_4_ = auVar137._24_4_ * 0.0;
      auVar33._28_4_ = auVar137._28_4_;
      auVar137 = vsubps_avx(ZEXT1632(auVar99),ZEXT1632(auVar98));
      auVar20 = vfmsub231ps_fma(auVar33,ZEXT1632(auVar97),auVar137);
      auVar34._4_4_ = auVar118._4_4_ * auVar137._4_4_;
      auVar34._0_4_ = auVar118._0_4_ * auVar137._0_4_;
      auVar34._8_4_ = auVar118._8_4_ * auVar137._8_4_;
      auVar34._12_4_ = auVar118._12_4_ * auVar137._12_4_;
      auVar34._16_4_ = auVar137._16_4_ * 0.0;
      auVar34._20_4_ = auVar137._20_4_ * 0.0;
      auVar34._24_4_ = auVar137._24_4_ * 0.0;
      auVar34._28_4_ = auVar137._28_4_;
      auVar136 = ZEXT1632(auVar98);
      auVar117 = vfmsub231ps_fma(auVar34,auVar136,auVar126);
      auVar126 = ZEXT1232(ZEXT412(0)) << 0x20;
      auVar20 = vfmadd231ps_fma(ZEXT1632(auVar117),auVar126,ZEXT1632(auVar20));
      auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar126,ZEXT1632(auVar18));
      auVar14 = vcmpps_avx(ZEXT1632(auVar20),ZEXT1232(ZEXT412(0)) << 0x20,2);
      _local_780 = vblendvps_avx(ZEXT1632(auVar140),ZEXT1632(auVar17),auVar14);
      local_660 = vblendvps_avx(ZEXT1632(auVar146),ZEXT1632(auVar19),auVar14);
      auVar126 = vblendvps_avx(ZEXT1632(auVar116),ZEXT1632(auVar100),auVar14);
      auVar137 = vblendvps_avx(auVar136,ZEXT1632(auVar99),auVar14);
      auVar103 = vblendvps_avx(ZEXT1632(auVar118),ZEXT1632(auVar130),auVar14);
      auVar182 = vblendvps_avx(ZEXT1632(auVar97),ZEXT1632(auVar102),auVar14);
      auVar136 = vblendvps_avx(ZEXT1632(auVar99),auVar136,auVar14);
      auVar109 = vblendvps_avx(ZEXT1632(auVar130),ZEXT1632(auVar118),auVar14);
      auVar20 = vpackssdw_avx(local_360._0_16_,local_360._16_16_);
      local_760 = ZEXT1632(auVar20);
      auVar178 = vblendvps_avx(ZEXT1632(auVar102),ZEXT1632(auVar97),auVar14);
      auVar21 = vsubps_avx(auVar136,_local_780);
      auVar109 = vsubps_avx(auVar109,local_660);
      auVar22 = vsubps_avx(auVar178,auVar126);
      auVar105 = vsubps_avx(_local_780,auVar137);
      auVar24 = vsubps_avx(local_660,auVar103);
      auVar23 = vsubps_avx(auVar126,auVar182);
      auVar35._4_4_ = auVar22._4_4_ * local_780._4_4_;
      auVar35._0_4_ = auVar22._0_4_ * local_780._0_4_;
      auVar35._8_4_ = auVar22._8_4_ * local_780._8_4_;
      auVar35._12_4_ = auVar22._12_4_ * local_780._12_4_;
      auVar35._16_4_ = auVar22._16_4_ * local_780._16_4_;
      auVar35._20_4_ = auVar22._20_4_ * local_780._20_4_;
      auVar35._24_4_ = auVar22._24_4_ * local_780._24_4_;
      auVar35._28_4_ = auVar178._28_4_;
      auVar102 = vfmsub231ps_fma(auVar35,auVar126,auVar21);
      auVar36._4_4_ = auVar21._4_4_ * local_660._4_4_;
      auVar36._0_4_ = auVar21._0_4_ * local_660._0_4_;
      auVar36._8_4_ = auVar21._8_4_ * local_660._8_4_;
      auVar36._12_4_ = auVar21._12_4_ * local_660._12_4_;
      auVar36._16_4_ = auVar21._16_4_ * local_660._16_4_;
      auVar36._20_4_ = auVar21._20_4_ * local_660._20_4_;
      auVar36._24_4_ = auVar21._24_4_ * local_660._24_4_;
      auVar36._28_4_ = auVar136._28_4_;
      auVar17 = vfmsub231ps_fma(auVar36,_local_780,auVar109);
      auVar102 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT832(0) << 0x20,ZEXT1632(auVar102));
      auVar107._0_4_ = auVar109._0_4_ * auVar126._0_4_;
      auVar107._4_4_ = auVar109._4_4_ * auVar126._4_4_;
      auVar107._8_4_ = auVar109._8_4_ * auVar126._8_4_;
      auVar107._12_4_ = auVar109._12_4_ * auVar126._12_4_;
      auVar107._16_4_ = auVar109._16_4_ * auVar126._16_4_;
      auVar107._20_4_ = auVar109._20_4_ * auVar126._20_4_;
      auVar107._24_4_ = auVar109._24_4_ * auVar126._24_4_;
      auVar107._28_4_ = 0;
      auVar17 = vfmsub231ps_fma(auVar107,local_660,auVar22);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar102),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
      auVar108._0_4_ = auVar23._0_4_ * auVar137._0_4_;
      auVar108._4_4_ = auVar23._4_4_ * auVar137._4_4_;
      auVar108._8_4_ = auVar23._8_4_ * auVar137._8_4_;
      auVar108._12_4_ = auVar23._12_4_ * auVar137._12_4_;
      auVar108._16_4_ = auVar23._16_4_ * auVar137._16_4_;
      auVar108._20_4_ = auVar23._20_4_ * auVar137._20_4_;
      auVar108._24_4_ = auVar23._24_4_ * auVar137._24_4_;
      auVar108._28_4_ = 0;
      auVar102 = vfmsub231ps_fma(auVar108,auVar105,auVar182);
      auVar122._0_4_ = auVar24._0_4_ * auVar182._0_4_;
      auVar122._4_4_ = auVar24._4_4_ * auVar182._4_4_;
      auVar122._8_4_ = auVar24._8_4_ * auVar182._8_4_;
      auVar122._12_4_ = auVar24._12_4_ * auVar182._12_4_;
      auVar122._16_4_ = auVar24._16_4_ * auVar182._16_4_;
      auVar122._20_4_ = auVar24._20_4_ * auVar182._20_4_;
      auVar122._24_4_ = auVar24._24_4_ * auVar182._24_4_;
      auVar122._28_4_ = 0;
      auVar18 = vfmsub231ps_fma(auVar122,auVar103,auVar23);
      auVar37._4_4_ = auVar105._4_4_ * auVar103._4_4_;
      auVar37._0_4_ = auVar105._0_4_ * auVar103._0_4_;
      auVar37._8_4_ = auVar105._8_4_ * auVar103._8_4_;
      auVar37._12_4_ = auVar105._12_4_ * auVar103._12_4_;
      auVar37._16_4_ = auVar105._16_4_ * auVar103._16_4_;
      auVar37._20_4_ = auVar105._20_4_ * auVar103._20_4_;
      auVar37._24_4_ = auVar105._24_4_ * auVar103._24_4_;
      auVar37._28_4_ = auVar103._28_4_;
      auVar19 = vfmsub231ps_fma(auVar37,auVar24,auVar137);
      auVar102 = vfmadd231ps_fma(ZEXT1632(auVar19),ZEXT832(0) << 0x20,ZEXT1632(auVar102));
      auVar18 = vfmadd231ps_fma(ZEXT1632(auVar102),ZEXT832(0) << 0x20,ZEXT1632(auVar18));
      auVar103 = vmaxps_avx(ZEXT1632(auVar17),ZEXT1632(auVar18));
      auVar103 = vcmpps_avx(auVar103,ZEXT832(0) << 0x20,2);
      auVar102 = vpackssdw_avx(auVar103._0_16_,auVar103._16_16_);
      auVar20 = vpand_avx(auVar102,auVar20);
      auVar103 = vpmovsxwd_avx2(auVar20);
      if ((((((((auVar103 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar103 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar103 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar103 >> 0x7f,0) == '\0') &&
            (auVar103 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar103 >> 0xbf,0) == '\0') &&
          (auVar103 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar103[0x1f]) {
LAB_01177333:
        auVar144 = ZEXT3264(CONCAT824(uStack_468,
                                      CONCAT816(uStack_470,CONCAT88(uStack_478,local_480))));
        auVar187 = ZEXT3264(auVar186);
        auVar197 = ZEXT3264(auVar125);
      }
      else {
        local_760 = ZEXT1632(auVar20);
        auVar123._0_4_ = auVar109._0_4_ * auVar23._0_4_;
        auVar123._4_4_ = auVar109._4_4_ * auVar23._4_4_;
        auVar123._8_4_ = auVar109._8_4_ * auVar23._8_4_;
        auVar123._12_4_ = auVar109._12_4_ * auVar23._12_4_;
        auVar123._16_4_ = auVar109._16_4_ * auVar23._16_4_;
        auVar123._20_4_ = auVar109._20_4_ * auVar23._20_4_;
        auVar123._24_4_ = auVar109._24_4_ * auVar23._24_4_;
        auVar123._28_4_ = 0;
        auVar99 = vfmsub231ps_fma(auVar123,auVar24,auVar22);
        auVar38._4_4_ = auVar22._4_4_ * auVar105._4_4_;
        auVar38._0_4_ = auVar22._0_4_ * auVar105._0_4_;
        auVar38._8_4_ = auVar22._8_4_ * auVar105._8_4_;
        auVar38._12_4_ = auVar22._12_4_ * auVar105._12_4_;
        auVar38._16_4_ = auVar22._16_4_ * auVar105._16_4_;
        auVar38._20_4_ = auVar22._20_4_ * auVar105._20_4_;
        auVar38._24_4_ = auVar22._24_4_ * auVar105._24_4_;
        auVar38._28_4_ = auVar137._28_4_;
        auVar100 = vfmsub231ps_fma(auVar38,auVar21,auVar23);
        auVar39._4_4_ = auVar21._4_4_ * auVar24._4_4_;
        auVar39._0_4_ = auVar21._0_4_ * auVar24._0_4_;
        auVar39._8_4_ = auVar21._8_4_ * auVar24._8_4_;
        auVar39._12_4_ = auVar21._12_4_ * auVar24._12_4_;
        auVar39._16_4_ = auVar21._16_4_ * auVar24._16_4_;
        auVar39._20_4_ = auVar21._20_4_ * auVar24._20_4_;
        auVar39._24_4_ = auVar21._24_4_ * auVar24._24_4_;
        auVar39._28_4_ = auVar21._28_4_;
        auVar130 = vfmsub231ps_fma(auVar39,auVar105,auVar109);
        auVar102 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar100),ZEXT1632(auVar130));
        auVar19 = vfmadd231ps_fma(ZEXT1632(auVar102),ZEXT1632(auVar99),ZEXT832(0) << 0x20);
        auVar137 = vrcpps_avx(ZEXT1632(auVar19));
        auVar189._8_4_ = 0x3f800000;
        auVar189._0_8_ = 0x3f8000003f800000;
        auVar189._12_4_ = 0x3f800000;
        auVar189._16_4_ = 0x3f800000;
        auVar189._20_4_ = 0x3f800000;
        auVar189._24_4_ = 0x3f800000;
        auVar189._28_4_ = 0x3f800000;
        auVar102 = vfnmadd213ps_fma(auVar137,ZEXT1632(auVar19),auVar189);
        auVar102 = vfmadd132ps_fma(ZEXT1632(auVar102),auVar137,auVar137);
        auVar40._4_4_ = auVar130._4_4_ * auVar126._4_4_;
        auVar40._0_4_ = auVar130._0_4_ * auVar126._0_4_;
        auVar40._8_4_ = auVar130._8_4_ * auVar126._8_4_;
        auVar40._12_4_ = auVar130._12_4_ * auVar126._12_4_;
        auVar40._16_4_ = auVar126._16_4_ * 0.0;
        auVar40._20_4_ = auVar126._20_4_ * 0.0;
        auVar40._24_4_ = auVar126._24_4_ * 0.0;
        auVar40._28_4_ = auVar126._28_4_;
        auVar100 = vfmadd231ps_fma(auVar40,ZEXT1632(auVar100),local_660);
        auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),ZEXT1632(auVar99),_local_780);
        fVar110 = auVar102._0_4_;
        fVar111 = auVar102._4_4_;
        fVar112 = auVar102._8_4_;
        fVar113 = auVar102._12_4_;
        auVar41._28_4_ = auVar182._28_4_;
        auVar41._0_28_ =
             ZEXT1628(CONCAT412(fVar113 * auVar100._12_4_,
                                CONCAT48(fVar112 * auVar100._8_4_,
                                         CONCAT44(fVar111 * auVar100._4_4_,fVar110 * auVar100._0_4_)
                                        )));
        auVar124._8_8_ = local_520._0_8_;
        auVar124._0_8_ = local_520._0_8_;
        auVar124._16_8_ = local_520._0_8_;
        auVar124._24_8_ = local_520._0_8_;
        fVar129 = ray->tfar;
        auVar151._4_4_ = fVar129;
        auVar151._0_4_ = fVar129;
        auVar151._8_4_ = fVar129;
        auVar151._12_4_ = fVar129;
        auVar151._16_4_ = fVar129;
        auVar151._20_4_ = fVar129;
        auVar151._24_4_ = fVar129;
        auVar151._28_4_ = fVar129;
        auVar126 = vcmpps_avx(auVar124,auVar41,2);
        auVar137 = vcmpps_avx(auVar41,auVar151,2);
        auVar126 = vandps_avx(auVar137,auVar126);
        auVar102 = vpackssdw_avx(auVar126._0_16_,auVar126._16_16_);
        auVar20 = vpand_avx(auVar102,auVar20);
        auVar126 = vpmovsxwd_avx2(auVar20);
        if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar126 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar126 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar126 >> 0x7f,0) == '\0') &&
              (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar126 >> 0xbf,0) == '\0') &&
            (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar126[0x1f]) goto LAB_01177333;
        auVar126 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT1632(auVar19),4);
        auVar102 = vpackssdw_avx(auVar126._0_16_,auVar126._16_16_);
        auVar20 = vpand_avx(auVar20,auVar102);
        auVar126 = vpmovsxwd_avx2(auVar20);
        auVar144 = ZEXT3264(CONCAT824(uStack_468,
                                      CONCAT816(uStack_470,CONCAT88(uStack_478,local_480))));
        auVar187 = ZEXT3264(auVar186);
        auVar197 = ZEXT3264(auVar125);
        if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar126 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar126 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar126 >> 0x7f,0) != '\0') ||
              (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar126 >> 0xbf,0) != '\0') ||
            (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar126[0x1f] < '\0') {
          auVar125 = ZEXT1632(CONCAT412(fVar113 * auVar17._12_4_,
                                        CONCAT48(fVar112 * auVar17._8_4_,
                                                 CONCAT44(fVar111 * auVar17._4_4_,
                                                          fVar110 * auVar17._0_4_))));
          auVar137 = ZEXT1632(CONCAT412(fVar113 * auVar18._12_4_,
                                        CONCAT48(fVar112 * auVar18._8_4_,
                                                 CONCAT44(fVar111 * auVar18._4_4_,
                                                          fVar110 * auVar18._0_4_))));
          auVar163._8_4_ = 0x3f800000;
          auVar163._0_8_ = 0x3f8000003f800000;
          auVar163._12_4_ = 0x3f800000;
          auVar163._16_4_ = 0x3f800000;
          auVar163._20_4_ = 0x3f800000;
          auVar163._24_4_ = 0x3f800000;
          auVar163._28_4_ = 0x3f800000;
          auVar186 = vsubps_avx(auVar163,auVar125);
          auVar186 = vblendvps_avx(auVar186,auVar125,auVar14);
          auVar187 = ZEXT3264(auVar186);
          auVar186 = vsubps_avx(auVar163,auVar137);
          local_380 = vblendvps_avx(auVar186,auVar137,auVar14);
          auVar144 = ZEXT3264(auVar126);
          auVar197 = ZEXT3264(auVar41);
        }
      }
      auVar203 = ZEXT3264(_local_540);
      auVar195 = ZEXT3264(local_6a0);
      auVar190 = ZEXT3264(local_680);
      auVar183 = ZEXT3264(local_6c0);
      auVar126 = auVar144._0_32_;
      auVar205 = ZEXT3264(local_5a0);
      if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar126 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar126 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar126 >> 0x7f,0) == '\0') &&
            (auVar144 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
           SUB321(auVar126 >> 0xbf,0) == '\0') &&
          (auVar144 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
          -1 < auVar144[0x1f]) goto LAB_0117611f;
      auVar186 = vsubps_avx(local_400,local_3e0);
      local_280 = auVar187._0_32_;
      auVar20 = vfmadd213ps_fma(auVar186,local_280,local_3e0);
      fVar129 = local_708->depth_scale;
      auVar186._4_4_ = (auVar20._4_4_ + auVar20._4_4_) * fVar129;
      auVar186._0_4_ = (auVar20._0_4_ + auVar20._0_4_) * fVar129;
      auVar186._8_4_ = (auVar20._8_4_ + auVar20._8_4_) * fVar129;
      auVar186._12_4_ = (auVar20._12_4_ + auVar20._12_4_) * fVar129;
      auVar186._16_4_ = fVar129 * 0.0;
      auVar186._20_4_ = fVar129 * 0.0;
      auVar186._24_4_ = fVar129 * 0.0;
      auVar186._28_4_ = 0;
      local_240 = auVar197._0_32_;
      auVar186 = vcmpps_avx(local_240,auVar186,6);
      auVar125 = auVar126 & auVar186;
      auVar167 = ZEXT3264(CONCAT428(local_560,
                                    CONCAT424(local_560,
                                              CONCAT420(local_560,
                                                        CONCAT416(local_560,
                                                                  CONCAT412(local_560,
                                                                            CONCAT48(local_560,
                                                                                     CONCAT44(
                                                  local_560,local_560))))))));
      auVar171 = ZEXT3264(CONCAT428(fStack_57c,
                                    CONCAT424(local_580,
                                              CONCAT420(fStack_57c,
                                                        CONCAT416(local_580,
                                                                  CONCAT412(fStack_57c,
                                                                            CONCAT48(local_580,
                                                                                     auVar16._0_8_))
                                                                 )))));
      auVar174 = ZEXT3264(local_620);
      auVar144 = ZEXT3264(local_500);
      if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar125 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar125 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar125 >> 0x7f,0) == '\0') &&
            (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar125 >> 0xbf,0) == '\0') &&
          (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar125[0x1f]) {
LAB_011761e8:
        bVar93 = 0;
      }
      else {
        auVar125._8_4_ = 0xbf800000;
        auVar125._0_8_ = 0xbf800000bf800000;
        auVar125._12_4_ = 0xbf800000;
        auVar125._16_4_ = 0xbf800000;
        auVar125._20_4_ = 0xbf800000;
        auVar125._24_4_ = 0xbf800000;
        auVar125._28_4_ = 0xbf800000;
        auVar138._8_4_ = 0x40000000;
        auVar138._0_8_ = 0x4000000040000000;
        auVar138._12_4_ = 0x40000000;
        auVar138._16_4_ = 0x40000000;
        auVar138._20_4_ = 0x40000000;
        auVar138._24_4_ = 0x40000000;
        auVar138._28_4_ = 0x40000000;
        auVar20 = vfmadd213ps_fma(local_380,auVar138,auVar125);
        local_260 = ZEXT1632(auVar20);
        local_220 = 0;
        local_21c = iVar11;
        local_210 = *(undefined8 *)*pauVar1;
        uStack_208 = *(undefined8 *)(*pauVar1 + 8);
        local_200 = *(undefined8 *)*pauVar2;
        uStack_1f8 = *(undefined8 *)(*pauVar2 + 8);
        local_1f0 = *(undefined8 *)*pauVar3;
        uStack_1e8 = *(undefined8 *)(*pauVar3 + 8);
        local_380 = ZEXT1632(auVar20);
        auVar125 = local_380;
        if ((pGVar12->mask & ray->mask) == 0) {
          bVar93 = 0;
          auVar144 = ZEXT3264(local_500);
        }
        else {
          auVar144 = ZEXT3264(local_500);
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (bVar93 = 1, pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            auVar126 = vandps_avx(auVar186,auVar126);
            fVar129 = 1.0 / auVar120._0_4_;
            local_1a0[0] = fVar129 * (auVar187._0_4_ + 0.0);
            local_1a0[1] = fVar129 * (auVar187._4_4_ + 1.0);
            local_1a0[2] = fVar129 * (auVar187._8_4_ + 2.0);
            local_1a0[3] = fVar129 * (auVar187._12_4_ + 3.0);
            fStack_190 = fVar129 * (auVar187._16_4_ + 4.0);
            fStack_18c = fVar129 * (auVar187._20_4_ + 5.0);
            fStack_188 = fVar129 * (auVar187._24_4_ + 6.0);
            fStack_184 = auVar187._28_4_ + 7.0;
            local_380._0_8_ = auVar20._0_8_;
            local_380._8_8_ = auVar20._8_8_;
            local_180 = local_380._0_8_;
            uStack_178 = local_380._8_8_;
            uStack_170 = 0;
            uStack_168 = 0;
            local_160 = local_240;
            uVar94 = vmovmskps_avx(auVar126);
            lVar90 = 0;
            uVar91 = CONCAT44((int)((ulong)context->args >> 0x20),uVar94);
            for (uVar89 = uVar91; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x8000000000000000) {
              lVar90 = lVar90 + 1;
            }
            local_6e0 = local_280;
            local_700 = local_240;
            local_380 = auVar125;
            while (uVar91 != 0) {
              local_760._0_8_ = uVar91;
              local_4d4 = local_1a0[lVar90];
              local_4d0 = *(undefined4 *)((long)&local_180 + lVar90 * 4);
              local_660._0_4_ = ray->tfar;
              local_780 = (undefined1  [8])lVar90;
              ray->tfar = *(float *)(local_160 + lVar90 * 4);
              fVar129 = 1.0 - local_4d4;
              auVar102 = ZEXT416((uint)local_4d4);
              auVar20 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar102,ZEXT416(0xc0a00000))
              ;
              auVar16 = vfmadd231ss_fma(ZEXT416((uint)(local_4d4 * local_4d4 * 3.0)),
                                        ZEXT416((uint)(local_4d4 + local_4d4)),auVar20);
              auVar20 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar102,ZEXT416(0x40000000))
              ;
              auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar129 * fVar129 * -3.0)),
                                        ZEXT416((uint)(fVar129 + fVar129)),auVar20);
              auVar17 = vfnmadd231ss_fma(ZEXT416((uint)(local_4d4 * (fVar129 + fVar129))),
                                         ZEXT416((uint)fVar129),ZEXT416((uint)fVar129));
              auVar102 = vfmadd231ss_fma(ZEXT416((uint)(local_4d4 * local_4d4)),auVar102,
                                         ZEXT416((uint)(fVar129 * -2.0)));
              fVar129 = auVar20._0_4_ * 0.5;
              fVar110 = auVar102._0_4_ * 0.5;
              auVar147._0_4_ = fVar110 * local_4a0;
              auVar147._4_4_ = fVar110 * fStack_49c;
              auVar147._8_4_ = fVar110 * fStack_498;
              auVar147._12_4_ = fVar110 * fStack_494;
              auVar131._4_4_ = fVar129;
              auVar131._0_4_ = fVar129;
              auVar131._8_4_ = fVar129;
              auVar131._12_4_ = fVar129;
              auVar76._8_8_ = uStack_5f8;
              auVar76._0_8_ = local_600;
              auVar20 = vfmadd132ps_fma(auVar131,auVar147,auVar76);
              fVar129 = auVar16._0_4_ * 0.5;
              auVar148._4_4_ = fVar129;
              auVar148._0_4_ = fVar129;
              auVar148._8_4_ = fVar129;
              auVar148._12_4_ = fVar129;
              auVar78._8_8_ = uStack_5e8;
              auVar78._0_8_ = local_5f0;
              auVar20 = vfmadd132ps_fma(auVar148,auVar20,auVar78);
              fVar129 = auVar17._0_4_ * 0.5;
              auVar132._4_4_ = fVar129;
              auVar132._0_4_ = fVar129;
              auVar132._8_4_ = fVar129;
              auVar132._12_4_ = fVar129;
              auVar80._8_8_ = uStack_5d8;
              auVar80._0_8_ = local_5e0;
              auVar20 = vfmadd132ps_fma(auVar132,auVar20,auVar80);
              local_5d0.context = context->user;
              local_4e0 = vmovlps_avx(auVar20);
              local_4d8 = vextractps_avx(auVar20,2);
              local_4cc = (int)local_4a8;
              local_4c8 = (int)local_710;
              local_4c4 = (local_5d0.context)->instID[0];
              local_4c0 = (local_5d0.context)->instPrimID[0];
              local_794 = -1;
              local_5d0.valid = &local_794;
              local_5d0.geometryUserPtr = pGVar12->userPtr;
              local_5d0.ray = (RTCRayN *)ray;
              local_5d0.hit = (RTCHitN *)&local_4e0;
              local_5d0.N = 1;
              if ((pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                 ((*pGVar12->occlusionFilterN)(&local_5d0), *local_5d0.valid != 0)) {
                p_Var13 = context->args->filter;
                if ((p_Var13 == (RTCFilterFunctionN)0x0) ||
                   ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                      RTC_RAY_QUERY_FLAG_INCOHERENT && (((pGVar12->field_8).field_0x2 & 0x40) == 0))
                    || ((*p_Var13)(&local_5d0), *local_5d0.valid != 0)))) {
                  bVar93 = 1;
                  auVar190 = ZEXT3264(local_680);
                  auVar183 = ZEXT3264(local_6c0);
                  auVar187 = ZEXT3264(local_6e0);
                  auVar197 = ZEXT3264(local_700);
                  auVar195 = ZEXT3264(local_6a0);
                  auVar205 = ZEXT3264(local_5a0);
                  auVar167 = ZEXT3264(CONCAT428(fStack_544,
                                                CONCAT424(fStack_548,
                                                          CONCAT420(fStack_54c,
                                                                    CONCAT416(fStack_550,
                                                                              CONCAT412(fStack_554,
                                                                                        CONCAT48(
                                                  fStack_558,CONCAT44(fStack_55c,local_560))))))));
                  auVar171 = ZEXT3264(CONCAT428(fStack_564,
                                                CONCAT424(fStack_568,
                                                          CONCAT420(fStack_56c,
                                                                    CONCAT416(fStack_570,
                                                                              CONCAT412(fStack_574,
                                                                                        CONCAT48(
                                                  fStack_578,CONCAT44(fStack_57c,local_580))))))));
                  auVar174 = ZEXT3264(local_620);
                  auVar144 = ZEXT3264(local_500);
                  auVar203 = ZEXT3264(_local_540);
                  goto LAB_01176143;
                }
              }
              ray->tfar = (float)local_660._0_4_;
              lVar90 = 0;
              uVar91 = local_760._0_8_ ^ 1L << ((ulong)local_780 & 0x3f);
              for (uVar89 = uVar91; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x8000000000000000) {
                lVar90 = lVar90 + 1;
              }
              auVar190 = ZEXT3264(local_680);
              auVar183 = ZEXT3264(local_6c0);
              auVar187 = ZEXT3264(local_6e0);
              auVar197 = ZEXT3264(local_700);
              auVar195 = ZEXT3264(local_6a0);
              auVar205 = ZEXT3264(local_5a0);
              auVar167 = ZEXT3264(CONCAT428(fStack_544,
                                            CONCAT424(fStack_548,
                                                      CONCAT420(fStack_54c,
                                                                CONCAT416(fStack_550,
                                                                          CONCAT412(fStack_554,
                                                                                    CONCAT48(
                                                  fStack_558,CONCAT44(fStack_55c,local_560))))))));
              auVar171 = ZEXT3264(CONCAT428(fStack_564,
                                            CONCAT424(fStack_568,
                                                      CONCAT420(fStack_56c,
                                                                CONCAT416(fStack_570,
                                                                          CONCAT412(fStack_574,
                                                                                    CONCAT48(
                                                  fStack_578,CONCAT44(fStack_57c,local_580))))))));
              auVar174 = ZEXT3264(local_620);
              auVar144 = ZEXT3264(local_500);
              auVar203 = ZEXT3264(_local_540);
            }
            goto LAB_011761e8;
          }
        }
      }
    }
LAB_01176143:
    auVar128 = ZEXT3264(local_640);
    if (8 < iVar11) {
      local_340 = (float)iVar11;
      fStack_33c = (float)iVar11;
      fStack_338 = (float)iVar11;
      fStack_334 = (float)iVar11;
      fStack_330 = (float)iVar11;
      fStack_32c = (float)iVar11;
      fStack_328 = (float)iVar11;
      iStack_324 = iVar11;
      local_360._4_4_ = local_740._0_4_;
      local_360._0_4_ = local_740._0_4_;
      local_360._8_4_ = local_740._0_4_;
      local_360._12_4_ = local_740._0_4_;
      local_360._16_4_ = local_740._0_4_;
      local_360._20_4_ = local_740._0_4_;
      local_360._24_4_ = local_740._0_4_;
      local_360._28_4_ = local_740._0_4_;
      local_120 = local_520._0_8_;
      uStack_118 = local_520._0_8_;
      uStack_110 = local_520._0_8_;
      uStack_108 = local_520._0_8_;
      local_140 = 1.0 / (float)local_3c0._0_4_;
      fStack_13c = local_140;
      fStack_138 = local_140;
      fStack_134 = local_140;
      fStack_130 = local_140;
      fStack_12c = local_140;
      fStack_128 = local_140;
      fStack_124 = local_140;
      lVar90 = 8;
      local_6e0 = auVar187._0_32_;
      local_700 = auVar197._0_32_;
      _local_540 = auVar203._0_32_;
LAB_01176667:
      if (lVar90 < local_790) {
        auVar178 = auVar183._0_32_;
        auVar126 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar90 * 4 + lVar92);
        local_740 = *(undefined1 (*) [32])(lVar92 + 0x22047f0 + lVar90 * 4);
        auVar186 = *(undefined1 (*) [32])(lVar92 + 0x2204c74 + lVar90 * 4);
        pauVar5 = (undefined1 (*) [28])(lVar92 + 0x22050f8 + lVar90 * 4);
        auVar86 = *pauVar5;
        auVar203._0_4_ = auVar167._0_4_ * *(float *)*pauVar5;
        auVar203._4_4_ = auVar167._4_4_ * *(float *)(*pauVar5 + 4);
        auVar203._8_4_ = auVar167._8_4_ * *(float *)(*pauVar5 + 8);
        auVar203._12_4_ = auVar167._12_4_ * *(float *)(*pauVar5 + 0xc);
        auVar203._16_4_ = auVar167._16_4_ * *(float *)(*pauVar5 + 0x10);
        auVar203._20_4_ = auVar167._20_4_ * *(float *)(*pauVar5 + 0x14);
        auVar203._28_36_ = auVar187._28_36_;
        auVar203._24_4_ = auVar167._24_4_ * *(float *)(*pauVar5 + 0x18);
        auVar42._4_4_ = auVar171._4_4_ * *(float *)(*pauVar5 + 4);
        auVar42._0_4_ = auVar171._0_4_ * *(float *)*pauVar5;
        auVar42._8_4_ = auVar171._8_4_ * *(float *)(*pauVar5 + 8);
        auVar42._12_4_ = auVar171._12_4_ * *(float *)(*pauVar5 + 0xc);
        auVar42._16_4_ = auVar171._16_4_ * *(float *)(*pauVar5 + 0x10);
        auVar42._20_4_ = auVar171._20_4_ * *(float *)(*pauVar5 + 0x14);
        auVar42._24_4_ = auVar171._24_4_ * *(float *)(*pauVar5 + 0x18);
        auVar42._28_4_ = *(undefined4 *)pauVar5[1];
        auVar182 = auVar195._0_32_;
        auVar20 = vfmadd231ps_fma(auVar203._0_32_,auVar186,auVar182);
        auVar16 = vfmadd231ps_fma(auVar42,auVar186,auVar205._0_32_);
        auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),local_740,auVar174._0_32_);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),local_740,auVar128._0_32_);
        auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar126,auVar144._0_32_);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar126,local_460);
        auVar125 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar90 * 4 + lVar92);
        auVar203 = ZEXT3264(auVar182);
        auVar137 = *(undefined1 (*) [32])(lVar92 + 0x2206c10 + lVar90 * 4);
        auVar103 = *(undefined1 (*) [32])(lVar92 + 0x2207094 + lVar90 * 4);
        pfVar6 = (float *)(lVar92 + 0x2207518 + lVar90 * 4);
        fVar15 = *pfVar6;
        fVar198 = pfVar6[1];
        fVar204 = pfVar6[2];
        fVar71 = pfVar6[3];
        fVar72 = pfVar6[4];
        fVar73 = pfVar6[5];
        fVar74 = pfVar6[6];
        auVar195._0_4_ = fVar15 * auVar167._0_4_;
        auVar195._4_4_ = fVar198 * auVar167._4_4_;
        auVar195._8_4_ = fVar204 * auVar167._8_4_;
        auVar195._12_4_ = fVar71 * auVar167._12_4_;
        auVar195._16_4_ = fVar72 * auVar167._16_4_;
        auVar195._20_4_ = fVar73 * auVar167._20_4_;
        auVar195._28_36_ = auVar171._28_36_;
        auVar195._24_4_ = fVar74 * auVar167._24_4_;
        auVar197._0_4_ = fVar15 * auVar171._0_4_;
        auVar197._4_4_ = fVar198 * auVar171._4_4_;
        auVar197._8_4_ = fVar204 * auVar171._8_4_;
        auVar197._12_4_ = fVar71 * auVar171._12_4_;
        auVar197._16_4_ = fVar72 * auVar171._16_4_;
        auVar197._20_4_ = fVar73 * auVar171._20_4_;
        auVar197._28_36_ = auVar167._28_36_;
        auVar197._24_4_ = fVar74 * auVar171._24_4_;
        auVar102 = vfmadd231ps_fma(auVar195._0_32_,auVar103,auVar182);
        auVar17 = vfmadd231ps_fma(auVar197._0_32_,auVar103,auVar205._0_32_);
        auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar137,auVar174._0_32_);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar137,auVar128._0_32_);
        auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar125,auVar144._0_32_);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar125,local_460);
        local_300 = ZEXT1632(auVar102);
        _local_420 = ZEXT1632(auVar20);
        local_2e0 = vsubps_avx(local_300,_local_420);
        local_400 = ZEXT1632(auVar17);
        local_3e0 = ZEXT1632(auVar16);
        local_320 = vsubps_avx(local_400,local_3e0);
        auVar43._4_4_ = auVar16._4_4_ * local_2e0._4_4_;
        auVar43._0_4_ = auVar16._0_4_ * local_2e0._0_4_;
        auVar43._8_4_ = auVar16._8_4_ * local_2e0._8_4_;
        auVar43._12_4_ = auVar16._12_4_ * local_2e0._12_4_;
        auVar43._16_4_ = local_2e0._16_4_ * 0.0;
        auVar43._20_4_ = local_2e0._20_4_ * 0.0;
        auVar43._24_4_ = local_2e0._24_4_ * 0.0;
        auVar43._28_4_ = auVar171._28_4_;
        fVar129 = local_320._0_4_;
        auVar187._0_4_ = auVar20._0_4_ * fVar129;
        fVar110 = local_320._4_4_;
        auVar187._4_4_ = auVar20._4_4_ * fVar110;
        fVar111 = local_320._8_4_;
        auVar187._8_4_ = auVar20._8_4_ * fVar111;
        fVar112 = local_320._12_4_;
        auVar187._12_4_ = auVar20._12_4_ * fVar112;
        fVar113 = local_320._16_4_;
        auVar187._16_4_ = fVar113 * 0.0;
        fVar114 = local_320._20_4_;
        auVar187._20_4_ = fVar114 * 0.0;
        fVar115 = local_320._24_4_;
        auVar187._28_36_ = auVar128._28_36_;
        auVar187._24_4_ = fVar115 * 0.0;
        auVar136 = vsubps_avx(auVar43,auVar187._0_32_);
        local_780._0_4_ = auVar86._0_4_;
        local_780._4_4_ = auVar86._4_4_;
        auStack_778._0_4_ = auVar86._8_4_;
        auStack_778._4_4_ = auVar86._12_4_;
        fStack_770 = auVar86._16_4_;
        fStack_76c = auVar86._20_4_;
        fStack_768 = auVar86._24_4_;
        auVar164._0_4_ = (float)local_e0 * (float)local_780._0_4_;
        auVar164._4_4_ = local_e0._4_4_ * (float)local_780._4_4_;
        auVar164._8_4_ = (float)uStack_d8 * (float)auStack_778._0_4_;
        auVar164._12_4_ = uStack_d8._4_4_ * (float)auStack_778._4_4_;
        auVar164._16_4_ = (float)uStack_d0 * fStack_770;
        auVar164._20_4_ = uStack_d0._4_4_ * fStack_76c;
        auVar164._24_4_ = (float)uStack_c8 * fStack_768;
        auVar164._28_4_ = 0;
        auVar20 = vfmadd231ps_fma(auVar164,auVar186,local_c0);
        auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),local_a0,local_740);
        auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),local_80,auVar126);
        auVar44._4_4_ = fVar198 * local_e0._4_4_;
        auVar44._0_4_ = fVar15 * (float)local_e0;
        auVar44._8_4_ = fVar204 * (float)uStack_d8;
        auVar44._12_4_ = fVar71 * uStack_d8._4_4_;
        auVar44._16_4_ = fVar72 * (float)uStack_d0;
        auVar44._20_4_ = fVar73 * uStack_d0._4_4_;
        auVar44._24_4_ = fVar74 * (float)uStack_c8;
        auVar44._28_4_ = uStack_c8._4_4_;
        auVar16 = vfmadd231ps_fma(auVar44,auVar103,local_c0);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar137,local_a0);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar125,local_80);
        auVar45._4_4_ = fVar110 * fVar110;
        auVar45._0_4_ = fVar129 * fVar129;
        auVar45._8_4_ = fVar111 * fVar111;
        auVar45._12_4_ = fVar112 * fVar112;
        auVar45._16_4_ = fVar113 * fVar113;
        auVar45._20_4_ = fVar114 * fVar114;
        auVar45._24_4_ = fVar115 * fVar115;
        auVar45._28_4_ = local_80._28_4_;
        auVar102 = vfmadd231ps_fma(auVar45,local_2e0,local_2e0);
        auVar182 = vmaxps_avx(ZEXT1632(auVar20),ZEXT1632(auVar16));
        auVar179._0_4_ = auVar182._0_4_ * auVar182._0_4_ * auVar102._0_4_;
        auVar179._4_4_ = auVar182._4_4_ * auVar182._4_4_ * auVar102._4_4_;
        auVar179._8_4_ = auVar182._8_4_ * auVar182._8_4_ * auVar102._8_4_;
        auVar179._12_4_ = auVar182._12_4_ * auVar182._12_4_ * auVar102._12_4_;
        auVar179._16_4_ = auVar182._16_4_ * auVar182._16_4_ * 0.0;
        auVar179._20_4_ = auVar182._20_4_ * auVar182._20_4_ * 0.0;
        auVar179._24_4_ = auVar182._24_4_ * auVar182._24_4_ * 0.0;
        auVar179._28_4_ = 0;
        auVar46._4_4_ = auVar136._4_4_ * auVar136._4_4_;
        auVar46._0_4_ = auVar136._0_4_ * auVar136._0_4_;
        auVar46._8_4_ = auVar136._8_4_ * auVar136._8_4_;
        auVar46._12_4_ = auVar136._12_4_ * auVar136._12_4_;
        auVar46._16_4_ = auVar136._16_4_ * auVar136._16_4_;
        auVar46._20_4_ = auVar136._20_4_ * auVar136._20_4_;
        auVar46._24_4_ = auVar136._24_4_ * auVar136._24_4_;
        auVar46._28_4_ = auVar136._28_4_;
        auVar182 = vcmpps_avx(auVar46,auVar179,2);
        local_220 = (int)lVar90;
        auVar180._4_4_ = local_220;
        auVar180._0_4_ = local_220;
        auVar180._8_4_ = local_220;
        auVar180._12_4_ = local_220;
        auVar180._16_4_ = local_220;
        auVar180._20_4_ = local_220;
        auVar180._24_4_ = local_220;
        auVar180._28_4_ = local_220;
        auVar136 = vpor_avx2(auVar180,_DAT_01fb4ba0);
        auVar84._4_4_ = fStack_33c;
        auVar84._0_4_ = local_340;
        auVar84._8_4_ = fStack_338;
        auVar84._12_4_ = fStack_334;
        auVar84._16_4_ = fStack_330;
        auVar84._20_4_ = fStack_32c;
        auVar84._24_4_ = fStack_328;
        auVar84._28_4_ = iStack_324;
        auVar109 = vpcmpgtd_avx2(auVar84,auVar136);
        auVar136 = auVar109 & auVar182;
        if ((((((((auVar136 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar136 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar136 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar136 >> 0x7f,0) != '\0') ||
              (auVar136 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar136 >> 0xbf,0) != '\0') ||
            (auVar136 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar136[0x1f] < '\0') {
          local_3c0 = vandps_avx(auVar109,auVar182);
          auVar47._4_4_ = fVar198 * (float)local_540._4_4_;
          auVar47._0_4_ = fVar15 * (float)local_540._0_4_;
          auVar47._8_4_ = fVar204 * fStack_538;
          auVar47._12_4_ = fVar71 * fStack_534;
          auVar47._16_4_ = fVar72 * fStack_530;
          auVar47._20_4_ = fVar73 * fStack_52c;
          auVar47._24_4_ = fVar74 * fStack_528;
          auVar47._28_4_ = auVar182._28_4_;
          auVar102 = vfmadd213ps_fma(auVar103,local_2c0,auVar47);
          auVar102 = vfmadd213ps_fma(auVar137,local_100,ZEXT1632(auVar102));
          auVar102 = vfmadd132ps_fma(auVar125,ZEXT1632(auVar102),local_440);
          auVar48._4_4_ = (float)local_540._4_4_ * (float)local_780._4_4_;
          auVar48._0_4_ = (float)local_540._0_4_ * (float)local_780._0_4_;
          auVar48._8_4_ = fStack_538 * (float)auStack_778._0_4_;
          auVar48._12_4_ = fStack_534 * (float)auStack_778._4_4_;
          auVar48._16_4_ = fStack_530 * fStack_770;
          auVar48._20_4_ = fStack_52c * fStack_76c;
          auVar48._24_4_ = fStack_528 * fStack_768;
          auVar48._28_4_ = auVar182._28_4_;
          auVar17 = vfmadd213ps_fma(auVar186,local_2c0,auVar48);
          auVar17 = vfmadd213ps_fma(local_740,local_100,ZEXT1632(auVar17));
          auVar186 = *(undefined1 (*) [32])(lVar92 + 0x220557c + lVar90 * 4);
          auVar125 = *(undefined1 (*) [32])(lVar92 + 0x2205a00 + lVar90 * 4);
          auVar137 = *(undefined1 (*) [32])(lVar92 + 0x2205e84 + lVar90 * 4);
          pfVar6 = (float *)(lVar92 + 0x2206308 + lVar90 * 4);
          fVar129 = *pfVar6;
          fVar110 = pfVar6[1];
          fVar111 = pfVar6[2];
          fVar112 = pfVar6[3];
          fVar113 = pfVar6[4];
          fVar114 = pfVar6[5];
          fVar115 = pfVar6[6];
          auVar172._0_4_ = local_560 * fVar129;
          auVar172._4_4_ = fStack_55c * fVar110;
          auVar172._8_4_ = fStack_558 * fVar111;
          auVar172._12_4_ = fStack_554 * fVar112;
          auVar172._16_4_ = fStack_550 * fVar113;
          auVar172._20_4_ = fStack_54c * fVar114;
          auVar172._24_4_ = fStack_548 * fVar115;
          auVar172._28_4_ = 0;
          auVar193._0_4_ = local_580 * fVar129;
          auVar193._4_4_ = fStack_57c * fVar110;
          auVar193._8_4_ = fStack_578 * fVar111;
          auVar193._12_4_ = fStack_574 * fVar112;
          auVar193._16_4_ = fStack_570 * fVar113;
          auVar193._20_4_ = fStack_56c * fVar114;
          auVar193._24_4_ = fStack_568 * fVar115;
          auVar193._28_4_ = 0;
          auVar49._4_4_ = fVar110 * (float)local_540._4_4_;
          auVar49._0_4_ = fVar129 * (float)local_540._0_4_;
          auVar49._8_4_ = fVar111 * fStack_538;
          auVar49._12_4_ = fVar112 * fStack_534;
          auVar49._16_4_ = fVar113 * fStack_530;
          auVar49._20_4_ = fVar114 * fStack_52c;
          auVar49._24_4_ = fVar115 * fStack_528;
          auVar49._28_4_ = pfVar6[7];
          auVar18 = vfmadd231ps_fma(auVar172,auVar137,local_6a0);
          auVar19 = vfmadd231ps_fma(auVar193,auVar137,local_5a0);
          auVar100 = vfmadd231ps_fma(auVar49,local_2c0,auVar137);
          auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar125,local_620);
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar125,local_640);
          auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),local_100,auVar125);
          auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar186,local_500);
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar186,local_460);
          auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar186,local_440);
          pfVar6 = (float *)(lVar92 + 0x2208728 + lVar90 * 4);
          fVar129 = *pfVar6;
          fVar110 = pfVar6[1];
          fVar111 = pfVar6[2];
          fVar112 = pfVar6[3];
          fVar113 = pfVar6[4];
          fVar114 = pfVar6[5];
          fVar115 = pfVar6[6];
          auVar50._4_4_ = fStack_55c * fVar110;
          auVar50._0_4_ = local_560 * fVar129;
          auVar50._8_4_ = fStack_558 * fVar111;
          auVar50._12_4_ = fStack_554 * fVar112;
          auVar50._16_4_ = fStack_550 * fVar113;
          auVar50._20_4_ = fStack_54c * fVar114;
          auVar50._24_4_ = fStack_548 * fVar115;
          auVar50._28_4_ = fStack_544;
          auVar51._4_4_ = fStack_57c * fVar110;
          auVar51._0_4_ = local_580 * fVar129;
          auVar51._8_4_ = fStack_578 * fVar111;
          auVar51._12_4_ = fStack_574 * fVar112;
          auVar51._16_4_ = fStack_570 * fVar113;
          auVar51._20_4_ = fStack_56c * fVar114;
          auVar51._24_4_ = fStack_568 * fVar115;
          auVar51._28_4_ = fStack_564;
          auVar52._4_4_ = fVar110 * (float)local_540._4_4_;
          auVar52._0_4_ = fVar129 * (float)local_540._0_4_;
          auVar52._8_4_ = fVar111 * fStack_538;
          auVar52._12_4_ = fVar112 * fStack_534;
          auVar52._16_4_ = fVar113 * fStack_530;
          auVar52._20_4_ = fVar114 * fStack_52c;
          auVar52._24_4_ = fVar115 * fStack_528;
          auVar52._28_4_ = pfVar6[7];
          auVar186 = *(undefined1 (*) [32])(lVar92 + 0x22082a4 + lVar90 * 4);
          auVar99 = vfmadd231ps_fma(auVar50,auVar186,local_6a0);
          auVar130 = vfmadd231ps_fma(auVar51,auVar186,local_5a0);
          auVar117 = vfmadd231ps_fma(auVar52,local_2c0,auVar186);
          auVar186 = *(undefined1 (*) [32])(lVar92 + 0x2207e20 + lVar90 * 4);
          auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar186,local_620);
          auVar130 = vfmadd231ps_fma(ZEXT1632(auVar130),auVar186,local_640);
          auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),local_100,auVar186);
          auVar186 = *(undefined1 (*) [32])(lVar92 + 0x220799c + lVar90 * 4);
          auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar186,local_500);
          auVar130 = vfmadd231ps_fma(ZEXT1632(auVar130),auVar186,local_460);
          auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),local_440,auVar186);
          auVar181._8_4_ = 0x7fffffff;
          auVar181._0_8_ = 0x7fffffff7fffffff;
          auVar181._12_4_ = 0x7fffffff;
          auVar181._16_4_ = 0x7fffffff;
          auVar181._20_4_ = 0x7fffffff;
          auVar181._24_4_ = 0x7fffffff;
          auVar181._28_4_ = 0x7fffffff;
          auVar186 = vandps_avx(ZEXT1632(auVar18),auVar181);
          auVar125 = vandps_avx(ZEXT1632(auVar19),auVar181);
          auVar125 = vmaxps_avx(auVar186,auVar125);
          auVar186 = vandps_avx(ZEXT1632(auVar100),auVar181);
          auVar186 = vmaxps_avx(auVar125,auVar186);
          auVar186 = vcmpps_avx(auVar186,local_360,1);
          auVar137 = vblendvps_avx(ZEXT1632(auVar18),local_2e0,auVar186);
          auVar103 = vblendvps_avx(ZEXT1632(auVar19),local_320,auVar186);
          auVar186 = vandps_avx(ZEXT1632(auVar99),auVar181);
          auVar125 = vandps_avx(ZEXT1632(auVar130),auVar181);
          auVar125 = vmaxps_avx(auVar186,auVar125);
          auVar186 = vandps_avx(auVar181,ZEXT1632(auVar117));
          auVar186 = vmaxps_avx(auVar125,auVar186);
          auVar125 = vcmpps_avx(auVar186,local_360,1);
          auVar186 = vblendvps_avx(ZEXT1632(auVar99),local_2e0,auVar125);
          auVar125 = vblendvps_avx(ZEXT1632(auVar130),local_320,auVar125);
          auVar17 = vfmadd213ps_fma(auVar126,local_440,ZEXT1632(auVar17));
          auVar18 = vfmadd213ps_fma(auVar137,auVar137,ZEXT832(0) << 0x20);
          auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar103,auVar103);
          auVar126 = vrsqrtps_avx(ZEXT1632(auVar18));
          fVar129 = auVar126._0_4_;
          fVar110 = auVar126._4_4_;
          fVar111 = auVar126._8_4_;
          fVar112 = auVar126._12_4_;
          fVar113 = auVar126._16_4_;
          fVar114 = auVar126._20_4_;
          fVar115 = auVar126._24_4_;
          auVar53._4_4_ = fVar110 * fVar110 * fVar110 * auVar18._4_4_ * -0.5;
          auVar53._0_4_ = fVar129 * fVar129 * fVar129 * auVar18._0_4_ * -0.5;
          auVar53._8_4_ = fVar111 * fVar111 * fVar111 * auVar18._8_4_ * -0.5;
          auVar53._12_4_ = fVar112 * fVar112 * fVar112 * auVar18._12_4_ * -0.5;
          auVar53._16_4_ = fVar113 * fVar113 * fVar113 * -0.0;
          auVar53._20_4_ = fVar114 * fVar114 * fVar114 * -0.0;
          auVar53._24_4_ = fVar115 * fVar115 * fVar115 * -0.0;
          auVar53._28_4_ = 0;
          auVar202._8_4_ = 0x3fc00000;
          auVar202._0_8_ = 0x3fc000003fc00000;
          auVar202._12_4_ = 0x3fc00000;
          auVar202._16_4_ = 0x3fc00000;
          auVar202._20_4_ = 0x3fc00000;
          auVar202._24_4_ = 0x3fc00000;
          auVar202._28_4_ = 0x3fc00000;
          auVar18 = vfmadd231ps_fma(auVar53,auVar202,auVar126);
          fVar129 = auVar18._0_4_;
          fVar110 = auVar18._4_4_;
          auVar54._4_4_ = auVar103._4_4_ * fVar110;
          auVar54._0_4_ = auVar103._0_4_ * fVar129;
          fVar111 = auVar18._8_4_;
          auVar54._8_4_ = auVar103._8_4_ * fVar111;
          fVar112 = auVar18._12_4_;
          auVar54._12_4_ = auVar103._12_4_ * fVar112;
          auVar54._16_4_ = auVar103._16_4_ * 0.0;
          auVar54._20_4_ = auVar103._20_4_ * 0.0;
          auVar54._24_4_ = auVar103._24_4_ * 0.0;
          auVar54._28_4_ = auVar126._28_4_;
          auVar55._4_4_ = fVar110 * -auVar137._4_4_;
          auVar55._0_4_ = fVar129 * -auVar137._0_4_;
          auVar55._8_4_ = fVar111 * -auVar137._8_4_;
          auVar55._12_4_ = fVar112 * -auVar137._12_4_;
          auVar55._16_4_ = -auVar137._16_4_ * 0.0;
          auVar55._20_4_ = -auVar137._20_4_ * 0.0;
          auVar55._24_4_ = -auVar137._24_4_ * 0.0;
          auVar55._28_4_ = auVar103._28_4_;
          auVar18 = vfmadd213ps_fma(auVar186,auVar186,ZEXT832(0) << 0x20);
          auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar125,auVar125);
          auVar126 = vrsqrtps_avx(ZEXT1632(auVar18));
          auVar56._28_4_ = local_320._28_4_;
          auVar56._0_28_ =
               ZEXT1628(CONCAT412(fVar112 * 0.0,
                                  CONCAT48(fVar111 * 0.0,CONCAT44(fVar110 * 0.0,fVar129 * 0.0))));
          fVar129 = auVar126._0_4_;
          fVar110 = auVar126._4_4_;
          fVar111 = auVar126._8_4_;
          fVar112 = auVar126._12_4_;
          fVar113 = auVar126._16_4_;
          fVar114 = auVar126._20_4_;
          fVar115 = auVar126._24_4_;
          auVar57._4_4_ = fVar110 * fVar110 * fVar110 * auVar18._4_4_ * -0.5;
          auVar57._0_4_ = fVar129 * fVar129 * fVar129 * auVar18._0_4_ * -0.5;
          auVar57._8_4_ = fVar111 * fVar111 * fVar111 * auVar18._8_4_ * -0.5;
          auVar57._12_4_ = fVar112 * fVar112 * fVar112 * auVar18._12_4_ * -0.5;
          auVar57._16_4_ = fVar113 * fVar113 * fVar113 * -0.0;
          auVar57._20_4_ = fVar114 * fVar114 * fVar114 * -0.0;
          auVar57._24_4_ = fVar115 * fVar115 * fVar115 * -0.0;
          auVar57._28_4_ = 0;
          auVar18 = vfmadd231ps_fma(auVar57,auVar202,auVar126);
          fVar129 = auVar18._0_4_;
          fVar110 = auVar18._4_4_;
          auVar58._4_4_ = auVar125._4_4_ * fVar110;
          auVar58._0_4_ = auVar125._0_4_ * fVar129;
          fVar111 = auVar18._8_4_;
          auVar58._8_4_ = auVar125._8_4_ * fVar111;
          fVar112 = auVar18._12_4_;
          auVar58._12_4_ = auVar125._12_4_ * fVar112;
          auVar58._16_4_ = auVar125._16_4_ * 0.0;
          auVar58._20_4_ = auVar125._20_4_ * 0.0;
          auVar58._24_4_ = auVar125._24_4_ * 0.0;
          auVar58._28_4_ = 0;
          auVar59._4_4_ = fVar110 * -auVar186._4_4_;
          auVar59._0_4_ = fVar129 * -auVar186._0_4_;
          auVar59._8_4_ = fVar111 * -auVar186._8_4_;
          auVar59._12_4_ = fVar112 * -auVar186._12_4_;
          auVar59._16_4_ = -auVar186._16_4_ * 0.0;
          auVar59._20_4_ = -auVar186._20_4_ * 0.0;
          auVar59._24_4_ = -auVar186._24_4_ * 0.0;
          auVar59._28_4_ = auVar126._28_4_;
          auVar60._28_4_ = 0xbf000000;
          auVar60._0_28_ =
               ZEXT1628(CONCAT412(fVar112 * 0.0,
                                  CONCAT48(fVar111 * 0.0,CONCAT44(fVar110 * 0.0,fVar129 * 0.0))));
          auVar18 = vfmadd213ps_fma(auVar54,ZEXT1632(auVar20),_local_420);
          auVar126 = ZEXT1632(auVar20);
          auVar19 = vfmadd213ps_fma(auVar55,auVar126,local_3e0);
          auVar100 = vfmadd213ps_fma(auVar56,auVar126,ZEXT1632(auVar17));
          auVar117 = vfnmadd213ps_fma(auVar54,auVar126,_local_420);
          auVar99 = vfmadd213ps_fma(auVar58,ZEXT1632(auVar16),local_300);
          auVar98 = vfnmadd213ps_fma(auVar55,auVar126,local_3e0);
          auVar126 = ZEXT1632(auVar16);
          auVar130 = vfmadd213ps_fma(auVar59,auVar126,local_400);
          local_740 = ZEXT1632(auVar20);
          auVar20 = vfnmadd231ps_fma(ZEXT1632(auVar17),local_740,auVar56);
          auVar17 = vfmadd213ps_fma(auVar60,auVar126,ZEXT1632(auVar102));
          auVar118 = vfnmadd213ps_fma(auVar58,auVar126,local_300);
          auVar140 = vfnmadd213ps_fma(auVar59,auVar126,local_400);
          auVar146 = vfnmadd231ps_fma(ZEXT1632(auVar102),ZEXT1632(auVar16),auVar60);
          local_520 = ZEXT1632(auVar146);
          auVar126 = vsubps_avx(ZEXT1632(auVar130),ZEXT1632(auVar98));
          auVar186 = vsubps_avx(ZEXT1632(auVar17),ZEXT1632(auVar20));
          auVar165._0_4_ = auVar126._0_4_ * auVar20._0_4_;
          auVar165._4_4_ = auVar126._4_4_ * auVar20._4_4_;
          auVar165._8_4_ = auVar126._8_4_ * auVar20._8_4_;
          auVar165._12_4_ = auVar126._12_4_ * auVar20._12_4_;
          auVar165._16_4_ = auVar126._16_4_ * 0.0;
          auVar165._20_4_ = auVar126._20_4_ * 0.0;
          auVar165._24_4_ = auVar126._24_4_ * 0.0;
          auVar165._28_4_ = 0;
          auVar102 = vfmsub231ps_fma(auVar165,ZEXT1632(auVar98),auVar186);
          auVar61._4_4_ = auVar117._4_4_ * auVar186._4_4_;
          auVar61._0_4_ = auVar117._0_4_ * auVar186._0_4_;
          auVar61._8_4_ = auVar117._8_4_ * auVar186._8_4_;
          auVar61._12_4_ = auVar117._12_4_ * auVar186._12_4_;
          auVar61._16_4_ = auVar186._16_4_ * 0.0;
          auVar61._20_4_ = auVar186._20_4_ * 0.0;
          auVar61._24_4_ = auVar186._24_4_ * 0.0;
          auVar61._28_4_ = auVar186._28_4_;
          auVar182 = ZEXT1632(auVar117);
          auVar186 = vsubps_avx(ZEXT1632(auVar99),auVar182);
          auVar109 = ZEXT1632(auVar20);
          auVar20 = vfmsub231ps_fma(auVar61,auVar109,auVar186);
          auVar62._4_4_ = auVar98._4_4_ * auVar186._4_4_;
          auVar62._0_4_ = auVar98._0_4_ * auVar186._0_4_;
          auVar62._8_4_ = auVar98._8_4_ * auVar186._8_4_;
          auVar62._12_4_ = auVar98._12_4_ * auVar186._12_4_;
          auVar62._16_4_ = auVar186._16_4_ * 0.0;
          auVar62._20_4_ = auVar186._20_4_ * 0.0;
          auVar62._24_4_ = auVar186._24_4_ * 0.0;
          auVar62._28_4_ = auVar186._28_4_;
          auVar117 = vfmsub231ps_fma(auVar62,auVar182,auVar126);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar117),ZEXT832(0) << 0x20,ZEXT1632(auVar20));
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),ZEXT832(0) << 0x20,ZEXT1632(auVar102));
          auVar14 = vcmpps_avx(ZEXT1632(auVar20),ZEXT832(0) << 0x20,2);
          auVar126 = vblendvps_avx(ZEXT1632(auVar118),ZEXT1632(auVar18),auVar14);
          local_660 = vblendvps_avx(ZEXT1632(auVar140),ZEXT1632(auVar19),auVar14);
          auVar186 = vblendvps_avx(local_520,ZEXT1632(auVar100),auVar14);
          auVar125 = vblendvps_avx(auVar182,ZEXT1632(auVar99),auVar14);
          auVar137 = vblendvps_avx(ZEXT1632(auVar98),ZEXT1632(auVar130),auVar14);
          auVar103 = vblendvps_avx(auVar109,ZEXT1632(auVar17),auVar14);
          auVar182 = vblendvps_avx(ZEXT1632(auVar99),auVar182,auVar14);
          auVar136 = vblendvps_avx(ZEXT1632(auVar130),ZEXT1632(auVar98),auVar14);
          auVar20 = vpackssdw_avx(local_3c0._0_16_,local_3c0._16_16_);
          local_760 = ZEXT1632(auVar20);
          auVar109 = vblendvps_avx(ZEXT1632(auVar17),auVar109,auVar14);
          auVar182 = vsubps_avx(auVar182,auVar126);
          auVar136 = vsubps_avx(auVar136,local_660);
          auVar21 = vsubps_avx(auVar109,auVar186);
          auVar22 = vsubps_avx(auVar126,auVar125);
          auVar105 = vsubps_avx(local_660,auVar137);
          auVar24 = vsubps_avx(auVar186,auVar103);
          auVar157._0_4_ = auVar21._0_4_ * auVar126._0_4_;
          auVar157._4_4_ = auVar21._4_4_ * auVar126._4_4_;
          auVar157._8_4_ = auVar21._8_4_ * auVar126._8_4_;
          auVar157._12_4_ = auVar21._12_4_ * auVar126._12_4_;
          auVar157._16_4_ = auVar21._16_4_ * auVar126._16_4_;
          auVar157._20_4_ = auVar21._20_4_ * auVar126._20_4_;
          auVar157._24_4_ = auVar21._24_4_ * auVar126._24_4_;
          auVar157._28_4_ = 0;
          auVar102 = vfmsub231ps_fma(auVar157,auVar186,auVar182);
          auVar63._4_4_ = auVar182._4_4_ * local_660._4_4_;
          auVar63._0_4_ = auVar182._0_4_ * local_660._0_4_;
          auVar63._8_4_ = auVar182._8_4_ * local_660._8_4_;
          auVar63._12_4_ = auVar182._12_4_ * local_660._12_4_;
          auVar63._16_4_ = auVar182._16_4_ * local_660._16_4_;
          auVar63._20_4_ = auVar182._20_4_ * local_660._20_4_;
          auVar63._24_4_ = auVar182._24_4_ * local_660._24_4_;
          auVar63._28_4_ = auVar109._28_4_;
          auVar17 = vfmsub231ps_fma(auVar63,auVar126,auVar136);
          auVar102 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT832(0) << 0x20,ZEXT1632(auVar102));
          auVar158._0_4_ = auVar136._0_4_ * auVar186._0_4_;
          auVar158._4_4_ = auVar136._4_4_ * auVar186._4_4_;
          auVar158._8_4_ = auVar136._8_4_ * auVar186._8_4_;
          auVar158._12_4_ = auVar136._12_4_ * auVar186._12_4_;
          auVar158._16_4_ = auVar136._16_4_ * auVar186._16_4_;
          auVar158._20_4_ = auVar136._20_4_ * auVar186._20_4_;
          auVar158._24_4_ = auVar136._24_4_ * auVar186._24_4_;
          auVar158._28_4_ = 0;
          auVar17 = vfmsub231ps_fma(auVar158,local_660,auVar21);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar102),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
          auVar159._0_4_ = auVar24._0_4_ * auVar125._0_4_;
          auVar159._4_4_ = auVar24._4_4_ * auVar125._4_4_;
          auVar159._8_4_ = auVar24._8_4_ * auVar125._8_4_;
          auVar159._12_4_ = auVar24._12_4_ * auVar125._12_4_;
          auVar159._16_4_ = auVar24._16_4_ * auVar125._16_4_;
          auVar159._20_4_ = auVar24._20_4_ * auVar125._20_4_;
          auVar159._24_4_ = auVar24._24_4_ * auVar125._24_4_;
          auVar159._28_4_ = 0;
          auVar102 = vfmsub231ps_fma(auVar159,auVar22,auVar103);
          auVar64._4_4_ = auVar105._4_4_ * auVar103._4_4_;
          auVar64._0_4_ = auVar105._0_4_ * auVar103._0_4_;
          auVar64._8_4_ = auVar105._8_4_ * auVar103._8_4_;
          auVar64._12_4_ = auVar105._12_4_ * auVar103._12_4_;
          auVar64._16_4_ = auVar105._16_4_ * auVar103._16_4_;
          auVar64._20_4_ = auVar105._20_4_ * auVar103._20_4_;
          auVar64._24_4_ = auVar105._24_4_ * auVar103._24_4_;
          auVar64._28_4_ = auVar103._28_4_;
          auVar18 = vfmsub231ps_fma(auVar64,auVar137,auVar24);
          auVar65._4_4_ = auVar22._4_4_ * auVar137._4_4_;
          auVar65._0_4_ = auVar22._0_4_ * auVar137._0_4_;
          auVar65._8_4_ = auVar22._8_4_ * auVar137._8_4_;
          auVar65._12_4_ = auVar22._12_4_ * auVar137._12_4_;
          auVar65._16_4_ = auVar22._16_4_ * auVar137._16_4_;
          auVar65._20_4_ = auVar22._20_4_ * auVar137._20_4_;
          auVar65._24_4_ = auVar22._24_4_ * auVar137._24_4_;
          auVar65._28_4_ = auVar137._28_4_;
          auVar19 = vfmsub231ps_fma(auVar65,auVar105,auVar125);
          auVar102 = vfmadd231ps_fma(ZEXT1632(auVar19),ZEXT832(0) << 0x20,ZEXT1632(auVar102));
          auVar18 = vfmadd231ps_fma(ZEXT1632(auVar102),ZEXT832(0) << 0x20,ZEXT1632(auVar18));
          auVar125 = vmaxps_avx(ZEXT1632(auVar17),ZEXT1632(auVar18));
          auVar125 = vcmpps_avx(auVar125,ZEXT832(0) << 0x20,2);
          auVar102 = vpackssdw_avx(auVar125._0_16_,auVar125._16_16_);
          auVar20 = vpand_avx(auVar102,auVar20);
          auVar203 = ZEXT1664(auVar20);
          auVar125 = vpmovsxwd_avx2(auVar20);
          if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar125 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar125 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar125 >> 0x7f,0) == '\0') &&
                (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar125 >> 0xbf,0) == '\0') &&
              (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar125[0x1f]) {
LAB_01177269:
            auVar143._8_8_ = uStack_478;
            auVar143._0_8_ = local_480;
            auVar143._16_8_ = uStack_470;
            auVar143._24_8_ = uStack_468;
            auVar190 = ZEXT3264(auVar190._0_32_);
            auVar183 = ZEXT3264(auVar178);
          }
          else {
            auVar66._4_4_ = auVar136._4_4_ * auVar24._4_4_;
            auVar66._0_4_ = auVar136._0_4_ * auVar24._0_4_;
            auVar66._8_4_ = auVar136._8_4_ * auVar24._8_4_;
            auVar66._12_4_ = auVar136._12_4_ * auVar24._12_4_;
            auVar66._16_4_ = auVar136._16_4_ * auVar24._16_4_;
            auVar66._20_4_ = auVar136._20_4_ * auVar24._20_4_;
            auVar66._24_4_ = auVar136._24_4_ * auVar24._24_4_;
            auVar66._28_4_ = auVar125._28_4_;
            auVar99 = vfmsub231ps_fma(auVar66,auVar105,auVar21);
            auVar166._0_4_ = auVar22._0_4_ * auVar21._0_4_;
            auVar166._4_4_ = auVar22._4_4_ * auVar21._4_4_;
            auVar166._8_4_ = auVar22._8_4_ * auVar21._8_4_;
            auVar166._12_4_ = auVar22._12_4_ * auVar21._12_4_;
            auVar166._16_4_ = auVar22._16_4_ * auVar21._16_4_;
            auVar166._20_4_ = auVar22._20_4_ * auVar21._20_4_;
            auVar166._24_4_ = auVar22._24_4_ * auVar21._24_4_;
            auVar166._28_4_ = 0;
            auVar100 = vfmsub231ps_fma(auVar166,auVar182,auVar24);
            auVar67._4_4_ = auVar182._4_4_ * auVar105._4_4_;
            auVar67._0_4_ = auVar182._0_4_ * auVar105._0_4_;
            auVar67._8_4_ = auVar182._8_4_ * auVar105._8_4_;
            auVar67._12_4_ = auVar182._12_4_ * auVar105._12_4_;
            auVar67._16_4_ = auVar182._16_4_ * auVar105._16_4_;
            auVar67._20_4_ = auVar182._20_4_ * auVar105._20_4_;
            auVar67._24_4_ = auVar182._24_4_ * auVar105._24_4_;
            auVar67._28_4_ = auVar105._28_4_;
            auVar130 = vfmsub231ps_fma(auVar67,auVar22,auVar136);
            auVar102 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar100),ZEXT1632(auVar130));
            auVar19 = vfmadd231ps_fma(ZEXT1632(auVar102),ZEXT1632(auVar99),ZEXT832(0) << 0x20);
            auVar125 = vrcpps_avx(ZEXT1632(auVar19));
            auVar194._8_4_ = 0x3f800000;
            auVar194._0_8_ = 0x3f8000003f800000;
            auVar194._12_4_ = 0x3f800000;
            auVar194._16_4_ = 0x3f800000;
            auVar194._20_4_ = 0x3f800000;
            auVar194._24_4_ = 0x3f800000;
            auVar194._28_4_ = 0x3f800000;
            auVar102 = vfnmadd213ps_fma(auVar125,ZEXT1632(auVar19),auVar194);
            auVar102 = vfmadd132ps_fma(ZEXT1632(auVar102),auVar125,auVar125);
            auVar68._4_4_ = auVar130._4_4_ * auVar186._4_4_;
            auVar68._0_4_ = auVar130._0_4_ * auVar186._0_4_;
            auVar68._8_4_ = auVar130._8_4_ * auVar186._8_4_;
            auVar68._12_4_ = auVar130._12_4_ * auVar186._12_4_;
            auVar68._16_4_ = auVar186._16_4_ * 0.0;
            auVar68._20_4_ = auVar186._20_4_ * 0.0;
            auVar68._24_4_ = auVar186._24_4_ * 0.0;
            auVar68._28_4_ = auVar186._28_4_;
            auVar100 = vfmadd231ps_fma(auVar68,ZEXT1632(auVar100),local_660);
            auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),ZEXT1632(auVar99),auVar126);
            fVar110 = auVar102._0_4_;
            fVar111 = auVar102._4_4_;
            fVar112 = auVar102._8_4_;
            fVar113 = auVar102._12_4_;
            auVar137 = ZEXT1632(CONCAT412(fVar113 * auVar100._12_4_,
                                          CONCAT48(fVar112 * auVar100._8_4_,
                                                   CONCAT44(fVar111 * auVar100._4_4_,
                                                            fVar110 * auVar100._0_4_))));
            fVar129 = ray->tfar;
            auVar142._4_4_ = fVar129;
            auVar142._0_4_ = fVar129;
            auVar142._8_4_ = fVar129;
            auVar142._12_4_ = fVar129;
            auVar142._16_4_ = fVar129;
            auVar142._20_4_ = fVar129;
            auVar142._24_4_ = fVar129;
            auVar142._28_4_ = fVar129;
            auVar85._8_8_ = uStack_118;
            auVar85._0_8_ = local_120;
            auVar85._16_8_ = uStack_110;
            auVar85._24_8_ = uStack_108;
            auVar186 = vcmpps_avx(auVar85,auVar137,2);
            auVar125 = vcmpps_avx(auVar137,auVar142,2);
            auVar186 = vandps_avx(auVar125,auVar186);
            auVar102 = vpackssdw_avx(auVar186._0_16_,auVar186._16_16_);
            auVar20 = vpand_avx(auVar20,auVar102);
            auVar186 = vpmovsxwd_avx2(auVar20);
            if ((((((((auVar186 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar186 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar186 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar186 >> 0x7f,0) == '\0') &&
                  (auVar186 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar186 >> 0xbf,0) == '\0') &&
                (auVar186 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar186[0x1f]) goto LAB_01177269;
            auVar186 = vcmpps_avx(ZEXT1632(auVar19),ZEXT832(0) << 0x20,4);
            auVar102 = vpackssdw_avx(auVar186._0_16_,auVar186._16_16_);
            auVar20 = vpand_avx(auVar20,auVar102);
            auVar186 = vpmovsxwd_avx2(auVar20);
            auVar143._8_8_ = uStack_478;
            auVar143._0_8_ = local_480;
            auVar143._16_8_ = uStack_470;
            auVar143._24_8_ = uStack_468;
            auVar190 = ZEXT3264(auVar190._0_32_);
            auVar183 = ZEXT3264(auVar178);
            if ((((((((auVar186 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar186 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar186 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar186 >> 0x7f,0) != '\0') ||
                  (auVar186 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar186 >> 0xbf,0) != '\0') ||
                (auVar186 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar186[0x1f] < '\0') {
              auVar103 = ZEXT1632(CONCAT412(fVar113 * auVar17._12_4_,
                                            CONCAT48(fVar112 * auVar17._8_4_,
                                                     CONCAT44(fVar111 * auVar17._4_4_,
                                                              fVar110 * auVar17._0_4_))));
              auVar69._28_4_ = SUB84(uStack_468,4);
              auVar69._0_28_ =
                   ZEXT1628(CONCAT412(fVar113 * auVar18._12_4_,
                                      CONCAT48(fVar112 * auVar18._8_4_,
                                               CONCAT44(fVar111 * auVar18._4_4_,
                                                        fVar110 * auVar18._0_4_))));
              auVar173._8_4_ = 0x3f800000;
              auVar173._0_8_ = 0x3f8000003f800000;
              auVar173._12_4_ = 0x3f800000;
              auVar173._16_4_ = 0x3f800000;
              auVar173._20_4_ = 0x3f800000;
              auVar173._24_4_ = 0x3f800000;
              auVar173._28_4_ = 0x3f800000;
              auVar125 = vsubps_avx(auVar173,auVar103);
              auVar125 = vblendvps_avx(auVar125,auVar103,auVar14);
              auVar190 = ZEXT3264(auVar125);
              auVar125 = vsubps_avx(auVar173,auVar69);
              local_3a0 = vblendvps_avx(auVar125,auVar69,auVar14);
              auVar183 = ZEXT3264(auVar137);
              auVar143 = auVar186;
            }
          }
          auVar205 = ZEXT3264(local_5a0);
          auVar197 = ZEXT3264(local_700);
          auVar195 = ZEXT3264(local_6a0);
          auVar187 = ZEXT3264(local_6e0);
          if ((((((((auVar143 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar143 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar143 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar143 >> 0x7f,0) == '\0') &&
                (auVar143 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar143 >> 0xbf,0) == '\0') &&
              (auVar143 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar143[0x1f]) goto LAB_01176e3d;
          auVar186 = vsubps_avx(ZEXT1632(auVar16),local_740);
          local_280 = auVar190._0_32_;
          auVar20 = vfmadd213ps_fma(auVar186,local_280,local_740);
          fVar129 = local_708->depth_scale;
          auVar70._4_4_ = (auVar20._4_4_ + auVar20._4_4_) * fVar129;
          auVar70._0_4_ = (auVar20._0_4_ + auVar20._0_4_) * fVar129;
          auVar70._8_4_ = (auVar20._8_4_ + auVar20._8_4_) * fVar129;
          auVar70._12_4_ = (auVar20._12_4_ + auVar20._12_4_) * fVar129;
          auVar70._16_4_ = fVar129 * 0.0;
          auVar70._20_4_ = fVar129 * 0.0;
          auVar70._24_4_ = fVar129 * 0.0;
          auVar70._28_4_ = fVar129;
          local_240 = auVar183._0_32_;
          auVar186 = vcmpps_avx(local_240,auVar70,6);
          auVar125 = auVar143 & auVar186;
          auVar167 = ZEXT3264(CONCAT428(fStack_544,
                                        CONCAT424(fStack_548,
                                                  CONCAT420(fStack_54c,
                                                            CONCAT416(fStack_550,
                                                                      CONCAT412(fStack_554,
                                                                                CONCAT48(fStack_558,
                                                                                         CONCAT44(
                                                  fStack_55c,local_560))))))));
          auVar171 = ZEXT3264(CONCAT428(fStack_564,
                                        CONCAT424(fStack_568,
                                                  CONCAT420(fStack_56c,
                                                            CONCAT416(fStack_570,
                                                                      CONCAT412(fStack_574,
                                                                                CONCAT48(fStack_578,
                                                                                         CONCAT44(
                                                  fStack_57c,local_580))))))));
          auVar174 = ZEXT3264(local_620);
          if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar125 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar125 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar125 >> 0x7f,0) == '\0') &&
                (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar125 >> 0xbf,0) == '\0') &&
              (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar125[0x1f]) {
            auVar128 = ZEXT3264(local_640);
            goto LAB_01176e58;
          }
          auVar127._8_4_ = 0xbf800000;
          auVar127._0_8_ = 0xbf800000bf800000;
          auVar127._12_4_ = 0xbf800000;
          auVar127._16_4_ = 0xbf800000;
          auVar127._20_4_ = 0xbf800000;
          auVar127._24_4_ = 0xbf800000;
          auVar127._28_4_ = 0xbf800000;
          auVar139._8_4_ = 0x40000000;
          auVar139._0_8_ = 0x4000000040000000;
          auVar139._12_4_ = 0x40000000;
          auVar139._16_4_ = 0x40000000;
          auVar139._20_4_ = 0x40000000;
          auVar139._24_4_ = 0x40000000;
          auVar139._28_4_ = 0x40000000;
          auVar20 = vfmadd213ps_fma(local_3a0,auVar139,auVar127);
          local_260 = ZEXT1632(auVar20);
          local_21c = iVar11;
          local_210 = local_5e0;
          uStack_208 = uStack_5d8;
          local_200 = local_5f0;
          uStack_1f8 = uStack_5e8;
          local_1f0 = local_600;
          uStack_1e8 = uStack_5f8;
          pGVar12 = (context->scene->geometries).items[local_710].ptr;
          local_3a0 = ZEXT1632(auVar20);
          auVar125 = local_3a0;
          if ((pGVar12->mask & ray->mask) == 0) {
            pRVar88 = (RTCIntersectArguments *)0x0;
            auVar128 = ZEXT3264(local_640);
          }
          else {
            pRVar88 = context->args;
            auVar128 = ZEXT3264(local_640);
            if ((pRVar88->filter != (RTCFilterFunctionN)0x0) ||
               (pRVar88 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar88 >> 8),1),
               pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              local_520 = ZEXT1632(CONCAT88(auVar146._8_8_,pGVar12));
              _auStack_778 = auVar126._8_24_;
              local_780 = (undefined1  [8])context;
              auVar126 = vandps_avx(auVar186,auVar143);
              local_680 = local_280;
              fVar129 = (float)local_220;
              local_1a0[0] = (fVar129 + auVar190._0_4_ + 0.0) * local_140;
              local_1a0[1] = (fVar129 + auVar190._4_4_ + 1.0) * fStack_13c;
              local_1a0[2] = (fVar129 + auVar190._8_4_ + 2.0) * fStack_138;
              local_1a0[3] = (fVar129 + auVar190._12_4_ + 3.0) * fStack_134;
              fStack_190 = (fVar129 + auVar190._16_4_ + 4.0) * fStack_130;
              fStack_18c = (fVar129 + auVar190._20_4_ + 5.0) * fStack_12c;
              fStack_188 = (fVar129 + auVar190._24_4_ + 6.0) * fStack_128;
              fStack_184 = fVar129 + auVar190._28_4_ + 7.0;
              local_3a0._0_8_ = auVar20._0_8_;
              local_3a0._8_8_ = auVar20._8_8_;
              local_180 = local_3a0._0_8_;
              uStack_178 = local_3a0._8_8_;
              uStack_170 = 0;
              uStack_168 = 0;
              local_6c0 = local_240;
              local_160 = local_240;
              uVar94 = vmovmskps_avx(auVar126);
              uVar89 = CONCAT44((int)((ulong)pRVar88 >> 0x20),uVar94);
              local_3a0 = auVar125;
              do {
                lVar25 = 0;
                for (uVar91 = uVar89; (uVar91 & 1) == 0; uVar91 = uVar91 >> 1 | 0x8000000000000000)
                {
                  lVar25 = lVar25 + 1;
                }
                local_740._0_8_ = lVar25;
                local_760._0_8_ = uVar89;
                if (uVar89 == 0) {
                  pRVar88 = (RTCIntersectArguments *)0x0;
                  goto LAB_011772b3;
                }
                local_4d4 = local_1a0[lVar25];
                local_4d0 = *(undefined4 *)((long)&local_180 + lVar25 * 4);
                local_660._0_4_ = ray->tfar;
                ray->tfar = *(float *)(local_160 + lVar25 * 4);
                fVar129 = 1.0 - local_4d4;
                auVar102 = ZEXT416((uint)local_4d4);
                auVar20 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar102,
                                          ZEXT416(0xc0a00000));
                auVar16 = vfmadd231ss_fma(ZEXT416((uint)(local_4d4 * local_4d4 * 3.0)),
                                          ZEXT416((uint)(local_4d4 + local_4d4)),auVar20);
                auVar20 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar102,
                                          ZEXT416(0x40000000));
                auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar129 * fVar129 * -3.0)),
                                          ZEXT416((uint)(fVar129 + fVar129)),auVar20);
                auVar17 = vfnmadd231ss_fma(ZEXT416((uint)(local_4d4 * (fVar129 + fVar129))),
                                           ZEXT416((uint)fVar129),ZEXT416((uint)fVar129));
                auVar102 = vfmadd231ss_fma(ZEXT416((uint)(local_4d4 * local_4d4)),auVar102,
                                           ZEXT416((uint)(fVar129 * -2.0)));
                fVar129 = auVar20._0_4_ * 0.5;
                fVar110 = auVar102._0_4_ * 0.5;
                auVar149._0_4_ = fVar110 * local_4a0;
                auVar149._4_4_ = fVar110 * fStack_49c;
                auVar149._8_4_ = fVar110 * fStack_498;
                auVar149._12_4_ = fVar110 * fStack_494;
                auVar133._4_4_ = fVar129;
                auVar133._0_4_ = fVar129;
                auVar133._8_4_ = fVar129;
                auVar133._12_4_ = fVar129;
                auVar77._8_8_ = uStack_5f8;
                auVar77._0_8_ = local_600;
                auVar20 = vfmadd132ps_fma(auVar133,auVar149,auVar77);
                fVar129 = auVar16._0_4_ * 0.5;
                auVar150._4_4_ = fVar129;
                auVar150._0_4_ = fVar129;
                auVar150._8_4_ = fVar129;
                auVar150._12_4_ = fVar129;
                auVar79._8_8_ = uStack_5e8;
                auVar79._0_8_ = local_5f0;
                auVar20 = vfmadd132ps_fma(auVar150,auVar20,auVar79);
                fVar129 = auVar17._0_4_ * 0.5;
                auVar134._4_4_ = fVar129;
                auVar134._0_4_ = fVar129;
                auVar134._8_4_ = fVar129;
                auVar134._12_4_ = fVar129;
                auVar81._8_8_ = uStack_5d8;
                auVar81._0_8_ = local_5e0;
                auVar20 = vfmadd132ps_fma(auVar134,auVar20,auVar81);
                local_5d0.context = *(RTCRayQueryContext **)((long)local_780 + 8);
                local_4e0 = vmovlps_avx(auVar20);
                local_4d8 = vextractps_avx(auVar20,2);
                local_4cc = (int)local_4a8;
                local_4c8 = (int)local_710;
                local_4c4 = (local_5d0.context)->instID[0];
                local_4c0 = (local_5d0.context)->instPrimID[0];
                local_794 = -1;
                local_5d0.valid = &local_794;
                local_5d0.geometryUserPtr = *(void **)(local_520._0_8_ + 0x18);
                local_5d0.ray = (RTCRayN *)ray;
                local_5d0.hit = (RTCHitN *)&local_4e0;
                local_5d0.N = 1;
                if (*(code **)(local_520._0_8_ + 0x48) == (code *)0x0) {
LAB_011771ea:
                  p_Var13 = (*(RTCIntersectArguments **)((long)local_780 + 0x10))->filter;
                  if ((p_Var13 == (RTCFilterFunctionN)0x0) ||
                     ((((*(RTCIntersectArguments **)((long)local_780 + 0x10))->flags &
                       RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) == RTC_RAY_QUERY_FLAG_INCOHERENT
                      && ((*(byte *)(local_520._0_8_ + 0x3e) & 0x40) == 0)))) goto LAB_011772ad;
                  auVar203 = ZEXT1664(auVar203._0_16_);
                  (*p_Var13)(&local_5d0);
                  if (*local_5d0.valid != 0) goto LAB_011772ad;
                }
                else {
                  auVar203 = ZEXT1664(auVar203._0_16_);
                  (**(code **)(local_520._0_8_ + 0x48))(&local_5d0);
                  if (*local_5d0.valid != 0) goto LAB_011771ea;
                }
                ray->tfar = (float)local_660._0_4_;
                uVar89 = local_760._0_8_ ^ 1L << (local_740._0_8_ & 0x3f);
              } while( true );
            }
          }
          goto LAB_01177261;
        }
        auVar183 = ZEXT3264(auVar178);
LAB_01176e3d:
        auVar205 = ZEXT3264(local_5a0);
        auVar197 = ZEXT3264(local_700);
        auVar195 = ZEXT3264(local_6a0);
        auVar187 = ZEXT3264(local_6e0);
        auVar128 = ZEXT3264(local_640);
        auVar167 = ZEXT3264(CONCAT428(fStack_544,
                                      CONCAT424(fStack_548,
                                                CONCAT420(fStack_54c,
                                                          CONCAT416(fStack_550,
                                                                    CONCAT412(fStack_554,
                                                                              CONCAT48(fStack_558,
                                                                                       CONCAT44(
                                                  fStack_55c,local_560))))))));
        auVar171 = ZEXT3264(CONCAT428(fStack_564,
                                      CONCAT424(fStack_568,
                                                CONCAT420(fStack_56c,
                                                          CONCAT416(fStack_570,
                                                                    CONCAT412(fStack_574,
                                                                              CONCAT48(fStack_578,
                                                                                       CONCAT44(
                                                  fStack_57c,local_580))))))));
        auVar174 = ZEXT3264(local_620);
        goto LAB_01176e58;
      }
    }
    if (bVar93 != 0) break;
    fVar129 = ray->tfar;
    auVar101._4_4_ = fVar129;
    auVar101._0_4_ = fVar129;
    auVar101._8_4_ = fVar129;
    auVar101._12_4_ = fVar129;
    auVar20 = vcmpps_avx(local_2a0,auVar101,2);
    uVar87 = vmovmskps_avx(auVar20);
    local_488 = (ulong)((uint)uVar95 & uVar87);
  }
  return local_488 != 0;
LAB_011772ad:
  pRVar88 = (RTCIntersectArguments *)0x1;
LAB_011772b3:
  auVar190 = ZEXT3264(local_680);
  auVar183 = ZEXT3264(local_6c0);
  auVar187 = ZEXT3264(local_6e0);
  auVar197 = ZEXT3264(local_700);
  auVar128 = ZEXT3264(local_640);
  auVar195 = ZEXT3264(local_6a0);
  auVar205 = ZEXT3264(local_5a0);
  auVar167 = ZEXT3264(CONCAT428(fStack_544,
                                CONCAT424(fStack_548,
                                          CONCAT420(fStack_54c,
                                                    CONCAT416(fStack_550,
                                                              CONCAT412(fStack_554,
                                                                        CONCAT48(fStack_558,
                                                                                 CONCAT44(fStack_55c
                                                                                          ,local_560
                                                                                         ))))))));
  auVar171 = ZEXT3264(CONCAT428(fStack_564,
                                CONCAT424(fStack_568,
                                          CONCAT420(fStack_56c,
                                                    CONCAT416(fStack_570,
                                                              CONCAT412(fStack_574,
                                                                        CONCAT48(fStack_578,
                                                                                 CONCAT44(fStack_57c
                                                                                          ,local_580
                                                                                         ))))))));
  auVar174 = ZEXT3264(local_620);
  context = (RayQueryContext *)local_780;
LAB_01177261:
  bVar93 = bVar93 | (byte)pRVar88;
LAB_01176e58:
  lVar90 = lVar90 + 8;
  auVar144 = ZEXT3264(local_500);
  goto LAB_01176667;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }